

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalJacobianContIntNoDamping
          (ChElementShellANCF_3443 *this,ChMatrixRef *H,double Kfactor)

{
  ulong uVar1;
  undefined1 (*pauVar2) [64];
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  PointerType pdVar43;
  long lVar44;
  long lVar45;
  uint uVar46;
  ChKblockGeneric *pCVar47;
  undefined8 uVar48;
  long lVar49;
  ulong uVar50;
  double *pdVar51;
  bool bVar52;
  int iVar53;
  int iVar54;
  double dVar55;
  char *__function;
  long lVar56;
  long lVar57;
  pointer pLVar58;
  long lVar59;
  long lVar60;
  ChElementShellANCF_3443 *this_00;
  undefined1 (*pauVar61) [64];
  long lVar62;
  ulong uVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  ActualDstType actualDst;
  long lVar67;
  Index outer;
  long lVar68;
  undefined1 (*pauVar69) [64];
  long lVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  double dVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  ChMatrixNM<double,_6,_6> D;
  DstEvaluatorType dstEvaluator_1;
  VectorNIP E4_Block;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict3 S_scaled_SD;
  Matrix3xN e_bar;
  DenseStorage<double,__1,__1,__1,_1> local_6280;
  DenseStorage<double,__1,__1,__1,_1> local_6260;
  ChMatrixRef *local_6240;
  int local_6238;
  int local_6234;
  ulong local_6230;
  long local_6228;
  undefined1 local_6220 [32];
  undefined1 local_6200 [64];
  Matrix3xN *local_6198;
  double local_6190;
  assign_op<double,_double> *local_6188;
  undefined1 local_6180 [32];
  undefined8 uStack_6160;
  double dStack_6158;
  undefined1 auStack_6150 [16];
  undefined1 local_6140 [64];
  undefined1 local_6100 [64];
  undefined1 local_60c0 [64];
  undefined1 local_6080 [96];
  Matrix3xN *local_6020;
  pointer local_6018;
  pointer local_6010;
  ChLoadableUV local_6008;
  ChLoadableUVW local_6000;
  pointer local_5ff8;
  Matrix3xN *local_5ff0;
  pointer local_5fe8;
  pointer local_5fe0;
  ChLoadableUV local_5fd8;
  ChLoadableUVW local_5fd0;
  pointer local_5fc8;
  Matrix3xN *local_5fc0;
  pointer local_5fb8;
  pointer local_5fb0;
  ChLoadableUV local_5fa8;
  ChLoadableUVW local_5fa0;
  pointer local_5f98;
  Matrix3xN *local_5f90;
  pointer local_5f88;
  pointer local_5f80;
  ChLoadableUV local_5f78;
  ChLoadableUVW local_5f70;
  pointer local_5f68;
  double local_5f60;
  double local_5f58;
  double local_5f50;
  double local_5f48;
  undefined1 local_5f40 [16];
  undefined1 *puStack_5f30;
  DstXprType *pDStack_5f28;
  undefined1 auStack_5f20 [32];
  undefined1 local_5f00 [64];
  undefined1 local_5ec0 [64];
  undefined1 local_5e80 [64];
  undefined1 local_5e40 [64];
  undefined1 local_5e00 [64];
  undefined1 local_5dc0 [64];
  undefined1 local_5d80 [64];
  undefined1 local_5d40 [64];
  undefined1 local_5d00 [64];
  undefined1 local_5cc0 [64];
  undefined1 local_5c80 [64];
  undefined1 local_5c40 [64];
  undefined1 local_5c00 [64];
  undefined1 local_5bc0 [64];
  undefined1 local_5b80 [64];
  undefined1 local_5b40 [64];
  undefined1 local_5b00 [64];
  undefined1 local_5ac0 [64];
  undefined1 local_5a80 [64];
  undefined1 local_5a40 [64];
  undefined1 local_5a00 [64];
  undefined1 local_59c0 [64];
  undefined1 local_5980 [64];
  undefined1 local_5940 [64];
  undefined1 local_5900 [64];
  undefined1 local_58c0 [64];
  undefined1 local_5880 [64];
  undefined1 local_5840 [64];
  undefined1 local_5800 [64];
  undefined1 local_57c0 [64];
  undefined1 local_5780 [64];
  undefined1 local_5740 [64];
  undefined1 local_5700 [64];
  undefined1 local_56c0 [64];
  undefined1 local_5680 [64];
  undefined1 local_5640 [64];
  undefined1 local_5600 [64];
  undefined1 local_55c0 [64];
  undefined1 local_5580 [64];
  undefined1 local_5540 [64];
  undefined1 local_5500 [64];
  undefined1 local_54c0 [64];
  undefined1 local_5480 [64];
  undefined1 local_5440 [64];
  undefined1 local_5400 [64];
  undefined1 local_53c0 [64];
  undefined1 local_5380 [64];
  undefined1 local_5340 [64];
  undefined1 local_5300 [64];
  undefined1 local_52c0 [64];
  undefined1 local_5280 [64];
  undefined1 local_5240 [64];
  undefined1 local_5200 [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  undefined1 local_5140 [64];
  undefined1 local_5100 [64];
  undefined1 local_50c0 [64];
  undefined1 local_5080 [64];
  undefined1 local_5040 [64];
  undefined1 local_5000 [64];
  undefined1 local_4fc0 [64];
  undefined1 local_4f80 [64];
  undefined1 local_4f40 [64];
  undefined1 local_4f00 [64];
  undefined1 local_4ec0 [64];
  undefined1 local_4e80 [64];
  undefined1 local_4e40 [64];
  undefined1 local_4e00 [64];
  undefined1 local_4dc0 [64];
  undefined1 local_4d80 [64];
  undefined1 local_4d40 [64];
  undefined1 local_4d00 [64];
  undefined1 local_4cc0 [64];
  undefined1 local_4c80 [64];
  undefined1 local_4c40 [64];
  undefined1 local_4c00 [64];
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [64];
  undefined1 local_4b40 [64];
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  undefined1 local_48c0 [64];
  undefined1 local_4880 [64];
  undefined1 local_4840 [64];
  undefined1 local_4800 [64];
  undefined1 local_47c0 [64];
  undefined1 local_4780 [64];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  undefined1 local_4500 [64];
  undefined1 local_44c0 [64];
  undefined1 local_4480 [64];
  undefined1 local_4440 [64];
  undefined1 local_4400 [64];
  undefined1 local_43c0 [64];
  undefined1 local_4380 [64];
  undefined1 local_4340 [64];
  undefined1 local_4300 [64];
  undefined1 local_42c0 [64];
  undefined1 local_4280 [64];
  undefined1 local_4240 [64];
  undefined1 local_4200 [64];
  undefined1 local_41c0 [64];
  undefined1 local_4180 [64];
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  undefined1 local_40c0 [64];
  undefined1 local_4080 [64];
  undefined1 local_4040 [64];
  undefined1 local_4000 [64];
  undefined1 local_3fc0 [64];
  undefined1 local_3f80 [64];
  undefined1 local_3f40 [64];
  undefined1 local_3f00 [64];
  undefined1 local_3ec0 [64];
  undefined1 local_3e80 [64];
  undefined1 local_3e40 [64];
  undefined1 local_3e00 [64];
  undefined1 local_3dc0 [64];
  undefined1 local_3d80 [64];
  undefined1 local_3d40 [64];
  undefined1 local_3d00 [64];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [64];
  undefined1 local_3c00 [64];
  undefined1 local_3bc0 [64];
  undefined1 local_3b80 [64];
  undefined1 local_3b40 [64];
  undefined1 local_3b00 [64];
  undefined1 local_3ac0 [64];
  undefined1 local_3a80 [64];
  undefined1 local_3a40 [64];
  undefined1 local_3a00 [64];
  undefined1 local_39c0 [64];
  undefined1 local_3980 [64];
  undefined1 local_3940 [64];
  undefined1 local_3900 [64];
  undefined1 local_38c0 [64];
  undefined1 local_3880 [64];
  undefined1 local_3840 [64];
  undefined1 local_3800 [64];
  undefined1 local_37c0 [64];
  undefined1 local_3780 [64];
  undefined1 local_3740 [64];
  undefined1 local_3700 [64];
  undefined1 local_36c0 [64];
  undefined1 local_3680 [64];
  undefined1 local_3640 [64];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [64];
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  undefined1 local_3300 [64];
  undefined1 local_32c0 [64];
  undefined1 local_3280 [64];
  undefined1 local_3240 [64];
  undefined1 local_3200 [8];
  Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> TStack_31f8;
  assign_op<double,_double> *paStack_31f0;
  variable_if_dynamic<long,__1> vStack_31e8;
  variable_if_dynamic<long,__1> vStack_31e0;
  long lStack_31d8;
  Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_> aTStack_31d0 [2];
  double *local_31c0;
  ulong uStack_31b0;
  pointer psStack_31a0;
  double *pdStack_3190;
  ulong local_3180;
  pointer psStack_3170;
  double *pdStack_3160;
  ulong uStack_3150;
  ChLoadableUV local_3140;
  double *pdStack_3130;
  ulong uStack_3120;
  ChLoadableUVW CStack_3110;
  double *local_3100;
  ulong uStack_30f0;
  pointer pLStack_30e0;
  double *pdStack_30d0;
  ulong local_30c0;
  undefined1 local_2f40 [11584];
  Matrix3xN local_200;
  
  local_6198 = (Matrix3xN *)Kfactor;
  CalcCoordMatrix(this,&local_200);
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_cols.m_value |
      (H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  TStack_31f8.m_matrix = (non_const_type)local_4fc0;
  local_3200 = (undefined1  [8])local_58c0;
  auVar74._56_8_ = 0;
  auVar74._0_56_ = local_4fc0._8_56_;
  local_4fc0 = auVar74 << 0x40;
  local_58c0._0_8_ =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_data;
  local_58c0._16_8_ =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value;
  paStack_31f0 = (assign_op<double,_double> *)local_6080;
  vStack_31e8.m_value = (long)H;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_3200);
  if (0 < this->m_numLayers) {
    local_6188 = (assign_op<double,_double> *)&this->m_SD;
    local_6234 = 0x40;
    local_6238 = 0x20;
    local_6230 = 0;
    dVar55 = 0.0;
    local_6240 = H;
    do {
      if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 0x10) {
LAB_00778e19:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 16, 96>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 16, BlockCols = 96, InnerPanel = false]"
        ;
LAB_00778dbf:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
      }
      uVar46 = SUB84(dVar55,0) * 0x60;
      uVar50 = CONCAT44(0,uVar46);
      lVar56 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      local_5f48 = (double)(uVar50 + 0x60);
      if (lVar56 < (long)local_5f48) goto LAB_00778e19;
      local_6228 = uVar50 * 8;
      local_3200 = (undefined1  [8])(*(long *)local_6188 + local_6228);
      paStack_31f0 = local_6188;
      aTStack_31d0[0].m_matrix = &local_200;
      vStack_31e8.m_value = 0;
      local_6190 = dVar55;
      vStack_31e0.m_value = uVar50;
      lStack_31d8 = lVar56;
      memset((Matrix<double,_96,_3,_0,_96,_3> *)local_58c0,0,0x900);
      local_4fc0._0_8_ = 0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,16,96,false>>,Eigen::Transpose<Eigen::Matrix<double,3,16,1,3,16>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,96,3,0,96,3>>
                ((Matrix<double,_96,_3,_0,_96,_3> *)local_58c0,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>_>
                  *)local_3200,aTStack_31d0,(Scalar *)local_4fc0);
      local_6220._16_8_ = 0.0;
      local_6220._0_8_ = (double *)0x0;
      local_6220._8_8_ = 0.0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                ((DenseStorage<double,__1,__1,__1,_1> *)local_6220,0x2400,0x30,0xc0);
      auVar74 = local_5c80;
      dVar55 = local_6190;
      local_5f58 = (double)(long)local_6234;
      local_5f60 = (double)(long)local_6238;
      local_5e40._0_8_ = uVar50;
      lVar67 = 0;
      lVar64 = 0;
      lVar65 = local_6220._16_8_ * 0x10;
      local_6230 = local_6230 & 0xffffffff;
      lVar49 = (long)(int)uVar46;
      uVar50 = lVar49 + 0x20;
      local_6200._0_8_ = uVar50;
      iVar53 = uVar46 + 0x20;
      lVar68 = (long)iVar53;
      local_5c40._0_4_ = iVar53;
      iVar54 = uVar46 + 0x40;
      uVar1 = lVar68 + 0x20;
      lVar70 = (long)iVar54;
      local_5c80._0_4_ = iVar54;
      lVar56 = lVar70 + 0x20;
      pauVar61 = (undefined1 (*) [64])(local_6220._0_8_ + 0x5c0);
      local_5900._0_8_ = local_6220._16_8_ * 0x18;
      do {
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar64) ||
             (lVar57 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar57 < (long)uVar50)) ||
            ((long)local_6220._8_8_ <= lVar67)) || ((long)local_6220._16_8_ < 0x20))
        goto LAB_00778d93;
        lVar57 = lVar57 * lVar64;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        auVar72._8_8_ = local_58c0._8_8_;
        auVar72._0_8_ = local_58c0._0_8_;
        auVar72._16_8_ = local_58c0._16_8_;
        auVar72._24_40_ = local_58c0._24_40_;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57),auVar72);
        pauVar61[-0x17] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 8),local_5880);
        pauVar61[-0x16] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x10),local_5840
                                );
        pauVar61[-0x15] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x18),local_5800
                                );
        pauVar61[-0x14] = auVar72;
        if (((iVar53 < 0) ||
            ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar64)) ||
           ((lVar57 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar57 < (long)uVar1 || ((ulong)local_6220._16_8_ < 0x40))))
        goto LAB_00778d93;
        lVar57 = lVar57 * lVar64;
        local_5cc0._0_8_ = lVar68 * 8;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57),local_57c0);
        pauVar61[-0x13] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 8),local_5780);
        pauVar61[-0x12] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x10),local_5740
                                );
        pauVar61[-0x11] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x18),local_5700
                                );
        pauVar61[-0x10] = auVar72;
        if (((iVar54 < 0) ||
            ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar64)) ||
           ((lVar57 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar57 < lVar56 || ((ulong)local_6220._16_8_ < 0x60))))
        goto LAB_00778d93;
        lVar57 = lVar57 * lVar64;
        local_5d00._0_8_ = lVar70 * 8;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57),local_56c0);
        pauVar61[-0xf] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 8),local_5680);
        pauVar61[-0xe] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x10),local_5640
                                );
        pauVar61[-0xd] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x18),local_5600
                                );
        pauVar61[-0xc] = auVar72;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar64) ||
             (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, (long)uVar63 < lVar56)) || (uVar63 < uVar1)) ||
           ((ulong)local_6220._16_8_ < 0x80)) goto LAB_00778d93;
        lVar57 = uVar63 * lVar64;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57),local_57c0);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57),local_56c0);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-0xb] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 8),local_5780);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 8),local_5680);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-10] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x10),local_5740
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x10),local_5640
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-9] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x18),local_5700
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x18),local_5600
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-8] = auVar72;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar64) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < lVar56)) ||
           ((uVar63 < uVar50 || ((ulong)local_6220._16_8_ < 0xa0)))) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = uVar63 * lVar64;
        auVar73._8_8_ = local_58c0._8_8_;
        auVar73._0_8_ = local_58c0._0_8_;
        auVar73._16_8_ = local_58c0._16_8_;
        auVar73._24_40_ = local_58c0._24_40_;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57),auVar73);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57),local_56c0);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-7] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 8),local_5880);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 8),local_5680);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-6] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x10),local_5840
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x10),local_5640
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-5] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x18),local_5800
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x18),local_5600
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-4] = auVar72;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar64) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < (long)uVar1)) ||
           ((uVar63 < uVar50 || ((ulong)local_6220._16_8_ < 0xc0)))) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = uVar63 * lVar64;
        auVar75._8_8_ = local_58c0._8_8_;
        auVar75._0_8_ = local_58c0._0_8_;
        auVar75._16_8_ = local_58c0._16_8_;
        auVar75._24_40_ = local_58c0._24_40_;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57),auVar75);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57),local_57c0);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-3] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 8),local_5880);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 8),local_5780);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-2] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x10),local_5840
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x10),local_5740
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        pauVar61[-1] = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x18),local_5800
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x18),local_5700
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *pauVar61 = auVar72;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar64) ||
            (lVar57 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar57 < (long)uVar50)) ||
           ((ulong)local_6220._8_8_ <= lVar67 + 1U)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = lVar57 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57),local_55c0);
        *(undefined1 (*) [64])(pauVar61[-0x17] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 8),local_5580);
        *(undefined1 (*) [64])(pauVar61[-0x16] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x10),local_5540
                                );
        *(undefined1 (*) [64])(pauVar61[-0x15] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x18),local_5500
                                );
        *(undefined1 (*) [64])(pauVar61[-0x14] + local_6220._16_8_ * 8) = auVar72;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar64) ||
           (lVar57 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar57 < (long)uVar1)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = lVar57 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57),local_54c0);
        *(undefined1 (*) [64])(pauVar61[-0x13] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 8),local_5480);
        *(undefined1 (*) [64])(pauVar61[-0x12] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x10),local_5440
                                );
        *(undefined1 (*) [64])(pauVar61[-0x11] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x18),local_5400
                                );
        *(undefined1 (*) [64])(pauVar61[-0x10] + local_6220._16_8_ * 8) = auVar72;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar64) ||
           (lVar57 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar57 < lVar56)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = lVar57 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57),local_53c0);
        *(undefined1 (*) [64])(pauVar61[-0xf] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 8),local_5380);
        *(undefined1 (*) [64])(pauVar61[-0xe] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x10),local_5340
                                );
        *(undefined1 (*) [64])(pauVar61[-0xd] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x18),local_5300
                                );
        *(undefined1 (*) [64])(pauVar61[-0xc] + local_6220._16_8_ * 8) = auVar72;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar64) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < lVar56)) || (uVar63 < uVar1))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = uVar63 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57),local_54c0);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57),local_53c0);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-0xb] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 8),local_5480);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 8),local_5380);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-10] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x10),local_5440
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x10),local_5340
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-9] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x18),local_5400
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x18),local_5300
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-8] + local_6220._16_8_ * 8) = auVar72;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar64) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < lVar56)) || (uVar63 < uVar50))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = uVar63 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57),local_55c0);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57),local_53c0);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-7] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 8),local_5580);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 8),local_5380);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-6] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x10),local_5540
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x10),local_5340
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-5] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x18),local_5500
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x18),local_5300
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-4] + local_6220._16_8_ * 8) = auVar72;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar64) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < (long)uVar1)) || (uVar63 < uVar50))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = uVar63 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57),local_55c0);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57),local_54c0);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-3] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 8),local_5580);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 8),local_5480);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-2] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x10),local_5540
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x10),local_5440
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-1] + local_6220._16_8_ * 8) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x18),local_5500
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x18),local_5400
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(*pauVar61 + local_6220._16_8_ * 8) = auVar72;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar64) ||
            (lVar57 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar57 < (long)uVar50)) ||
           ((ulong)local_6220._8_8_ <= lVar67 + 2U)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = lVar57 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57),local_52c0);
        *(undefined1 (*) [64])(pauVar61[-0x17] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 8),local_5280);
        *(undefined1 (*) [64])(pauVar61[-0x16] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x10),local_5240
                                );
        *(undefined1 (*) [64])(pauVar61[-0x15] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x18),local_5200
                                );
        *(undefined1 (*) [64])(pauVar61[-0x14] + lVar65) = auVar72;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar64) ||
           (lVar57 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar57 < (long)uVar1)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = lVar57 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57),local_51c0);
        *(undefined1 (*) [64])(pauVar61[-0x13] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 8),local_5180);
        *(undefined1 (*) [64])(pauVar61[-0x12] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x10),local_5140
                                );
        *(undefined1 (*) [64])(pauVar61[-0x11] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x18),local_5100
                                );
        *(undefined1 (*) [64])(pauVar61[-0x10] + lVar65) = auVar72;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar64) ||
           (lVar57 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar57 < lVar56)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = lVar57 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57),local_50c0);
        *(undefined1 (*) [64])(pauVar61[-0xf] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 8),local_5080);
        *(undefined1 (*) [64])(pauVar61[-0xe] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x10),local_5040
                                );
        *(undefined1 (*) [64])(pauVar61[-0xd] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x18),local_5000
                                );
        *(undefined1 (*) [64])(pauVar61[-0xc] + lVar65) = auVar72;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar64) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < lVar56)) || (uVar63 < uVar1))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = uVar63 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57),local_51c0);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57),local_50c0);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-0xb] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 8),local_5180);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 8),local_5080);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-10] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x10),local_5140
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x10),local_5040
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-9] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x18),local_5100
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x18),local_5000
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-8] + lVar65) = auVar72;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar64) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < lVar56)) || (uVar63 < uVar50))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = uVar63 * lVar64;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57),local_52c0);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57),local_50c0);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-7] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 8),local_5280);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 8),local_5080);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-6] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x10),local_5240
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x10),local_5040
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-5] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar57 + 0x18),local_5200
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x18),local_5000
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-4] + lVar65) = auVar72;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar64) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < (long)uVar1)) || (uVar63 < uVar50))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar57 = uVar63 * lVar64;
        lVar67 = lVar67 + 3;
        lVar64 = lVar64 + 1;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57),local_52c0);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57),local_51c0);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-3] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 8),local_5280);
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 8),local_5180);
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-2] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x10),local_5240
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x10),local_5140
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(pauVar61[-1] + lVar65) = auVar72;
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar57 + 0x18),local_5200
                                );
        auVar73 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar49 + lVar57 + 0x18),local_5100
                                );
        auVar72 = vaddpd_avx512f(auVar72,auVar73);
        *(undefined1 (*) [64])(*pauVar61 + lVar65) = auVar72;
        pauVar61 = (undefined1 (*) [64])(*pauVar61 + local_6220._16_8_ * 0x18);
      } while (lVar67 != 0x30);
      local_3200 = (undefined1  [8])local_6198;
      TStack_31f8.m_matrix = (non_const_type)local_58c0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_6198;
      auVar72 = vbroadcastsd_avx512f(auVar5);
      auVar76._8_8_ = local_58c0._8_8_;
      auVar76._0_8_ = local_58c0._0_8_;
      auVar76._16_8_ = local_58c0._16_8_;
      auVar76._24_40_ = local_58c0._24_40_;
      local_4fc0 = vmulpd_avx512f(auVar72,auVar76);
      local_5c80._0_8_ = (long)local_6190 * 0x20 + 0x20;
      local_5c80._8_56_ = auVar74._8_56_;
      local_4f80 = vmulpd_avx512f(auVar72,local_5880);
      local_4f40 = vmulpd_avx512f(auVar72,local_5840);
      local_4f00 = vmulpd_avx512f(auVar72,local_5800);
      local_4ec0 = vmulpd_avx512f(auVar72,local_57c0);
      local_4e80 = vmulpd_avx512f(auVar72,local_5780);
      local_4e40 = vmulpd_avx512f(auVar72,local_5740);
      local_4e00 = vmulpd_avx512f(auVar72,local_5700);
      local_4dc0 = vmulpd_avx512f(auVar72,local_56c0);
      local_4d80 = vmulpd_avx512f(auVar72,local_5680);
      local_4d40 = vmulpd_avx512f(auVar72,local_5640);
      local_4d00 = vmulpd_avx512f(auVar72,local_5600);
      local_4cc0 = vmulpd_avx512f(auVar72,local_55c0);
      local_4c80 = vmulpd_avx512f(auVar72,local_5580);
      local_4c40 = vmulpd_avx512f(auVar72,local_5540);
      local_4c00 = vmulpd_avx512f(auVar72,local_5500);
      local_4bc0 = vmulpd_avx512f(auVar72,local_54c0);
      local_4b80 = vmulpd_avx512f(auVar72,local_5480);
      local_4b40 = vmulpd_avx512f(auVar72,local_5440);
      local_4b00 = vmulpd_avx512f(auVar72,local_5400);
      local_4ac0 = vmulpd_avx512f(auVar72,local_53c0);
      local_4a80 = vmulpd_avx512f(auVar72,local_5380);
      local_4a40 = vmulpd_avx512f(auVar72,local_5340);
      local_4a00 = vmulpd_avx512f(auVar72,local_5300);
      local_49c0 = vmulpd_avx512f(auVar72,local_52c0);
      local_4980 = vmulpd_avx512f(auVar72,local_5280);
      local_4940 = vmulpd_avx512f(auVar72,local_5240);
      local_4900 = vmulpd_avx512f(auVar72,local_5200);
      local_48c0 = vmulpd_avx512f(auVar72,local_51c0);
      local_4880 = vmulpd_avx512f(auVar72,local_5180);
      local_4840 = vmulpd_avx512f(auVar72,local_5140);
      local_4800 = vmulpd_avx512f(auVar72,local_5100);
      local_47c0 = vmulpd_avx512f(auVar72,local_50c0);
      local_4780 = vmulpd_avx512f(auVar72,local_5080);
      local_4740 = vmulpd_avx512f(auVar72,local_5040);
      local_4700 = vmulpd_avx512f(auVar72,local_5000);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)local_5c80._0_8_) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00778de3;
      pdVar51 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar49 = 0x2c0;
      do {
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20),
                                 *(undefined1 (*) [64])(local_5280 + lVar49));
        *(undefined1 (*) [64])(local_5280 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20 + 8),
                                 *(undefined1 (*) [64])(local_5240 + lVar49));
        *(undefined1 (*) [64])(local_5240 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20 + 0x10),
                                 *(undefined1 (*) [64])(local_5200 + lVar49));
        *(undefined1 (*) [64])(local_5200 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20 + 0x18),
                                 *(undefined1 (*) [64])(local_51c0 + lVar49));
        *(undefined1 (*) [64])(local_51c0 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20),
                                 *(undefined1 (*) [64])(local_5180 + lVar49));
        *(undefined1 (*) [64])(local_5180 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20 + 8),
                                 *(undefined1 (*) [64])(local_5140 + lVar49));
        *(undefined1 (*) [64])(local_5140 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20 + 0x10),
                                 *(undefined1 (*) [64])(local_5100 + lVar49));
        *(undefined1 (*) [64])(local_5100 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20 + 0x18),
                                 *(undefined1 (*) [64])(local_50c0 + lVar49));
        *(undefined1 (*) [64])(local_50c0 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20),
                                 *(undefined1 (*) [64])(local_5080 + lVar49));
        *(undefined1 (*) [64])(local_5080 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20 + 8),
                                 *(undefined1 (*) [64])(local_5040 + lVar49));
        *(undefined1 (*) [64])(local_5040 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20 + 0x10),
                                 *(undefined1 (*) [64])(local_5000 + lVar49));
        *(undefined1 (*) [64])(local_5000 + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + (long)local_6190 * 0x20 + 0x18),
                                 *(undefined1 (*) [64])(local_4fc0 + lVar49));
        *(undefined1 (*) [64])(local_4fc0 + lVar49) = auVar74;
        lVar49 = lVar49 + 0x300;
      } while (lVar49 != 0xbc0);
      local_6280.m_cols = 0;
      local_6280.m_data = (double *)0x0;
      local_6280.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_6280,0x2400,0x30,0xc0);
      lVar64 = 0;
      lVar65 = 0;
      uVar50 = local_5e40._0_8_ + 0x20;
      pauVar61 = (undefined1 (*) [64])(local_6280.m_data + 0xb8);
      lVar49 = local_6280.m_cols * 0x10;
      local_6200._0_8_ = uVar50;
      local_5c40._0_8_ = local_6280.m_cols * 0x18;
      do {
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar65) ||
             (lVar67 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar67 < (long)uVar50)) || (local_6280.m_rows <= lVar64))
           || (local_6280.m_cols < 0x20)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = lVar67 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])((long)pdVar51 + lVar67 * 8 + local_6228),
                                 local_4fc0);
        pauVar61[-0x17] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_6228 + 0x40),local_4f80);
        pauVar61[-0x16] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_6228 + 0x80),local_4f40);
        pauVar61[-0x15] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_6228 + 0xc0),local_4f00);
        pauVar61[-0x14] = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (lVar67 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar67 < (long)uVar1)) || ((ulong)local_6280.m_cols < 0x40))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = lVar67 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_),local_4ec0);
        pauVar61[-0x13] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_ + 0x40),local_4e80)
        ;
        pauVar61[-0x12] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_ + 0x80),local_4e40)
        ;
        pauVar61[-0x11] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_ + 0xc0),local_4e00)
        ;
        pauVar61[-0x10] = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (lVar67 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar67 < lVar56)) || ((ulong)local_6280.m_cols < 0x60))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = lVar67 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_),local_4dc0);
        pauVar61[-0xf] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_ + 0x40),local_4d80)
        ;
        pauVar61[-0xe] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_ + 0x80),local_4d40)
        ;
        pauVar61[-0xd] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_ + 0xc0),local_4d00)
        ;
        pauVar61[-0xc] = auVar74;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar65) ||
             (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, (long)uVar63 < lVar56)) || (uVar63 < uVar1)) ||
           ((ulong)local_6280.m_cols < 0x80)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = uVar63 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67),local_4ec0);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67),local_4dc0);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-0xb] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 8),local_4e80);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 8),local_4d80);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-10] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x10),local_4e40
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x10),local_4d40
                                );
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-9] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x18),local_4e00
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x18),local_4d00
                                );
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-8] = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < lVar56)) ||
           ((uVar63 < uVar50 || ((ulong)local_6280.m_cols < 0xa0)))) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = uVar63 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67),local_4fc0);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67),
                                 local_4dc0);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-7] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 8),local_4f80);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 8),
                                 local_4d80);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-6] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x10),local_4f40
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x10),
                                 local_4d40);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-5] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x18),local_4f00
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x18),
                                 local_4d00);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-4] = auVar74;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar65) ||
             (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, (long)uVar63 < (long)uVar1)) || (uVar63 < uVar50)) ||
           ((ulong)local_6280.m_cols < 0xc0)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = uVar63 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67),local_4fc0);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67),
                                 local_4ec0);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-3] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 8),local_4f80);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 8),
                                 local_4e80);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-2] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x10),local_4f40
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x10),
                                 local_4e40);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        pauVar61[-1] = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x18),local_4f00
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x18),
                                 local_4e00);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *pauVar61 = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (lVar67 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar67 < (long)uVar50)) ||
           ((ulong)local_6280.m_rows <= lVar64 + 1U)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = lVar67 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])((long)pdVar51 + lVar67 * 8 + local_6228),
                                 local_4cc0);
        *(undefined1 (*) [64])(pauVar61[-0x17] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_6228 + 0x40),local_4c80);
        *(undefined1 (*) [64])(pauVar61[-0x16] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_6228 + 0x80),local_4c40);
        *(undefined1 (*) [64])(pauVar61[-0x15] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_6228 + 0xc0),local_4c00);
        *(undefined1 (*) [64])(pauVar61[-0x14] + local_6280.m_cols * 8) = auVar74;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar65) ||
           (lVar67 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar67 < (long)uVar1)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = lVar67 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_),local_4bc0);
        *(undefined1 (*) [64])(pauVar61[-0x13] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_ + 0x40),local_4b80)
        ;
        *(undefined1 (*) [64])(pauVar61[-0x12] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_ + 0x80),local_4b40)
        ;
        *(undefined1 (*) [64])(pauVar61[-0x11] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_ + 0xc0),local_4b00)
        ;
        *(undefined1 (*) [64])(pauVar61[-0x10] + local_6280.m_cols * 8) = auVar74;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar65) ||
           (lVar67 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar67 < lVar56)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = lVar67 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_),local_4ac0);
        *(undefined1 (*) [64])(pauVar61[-0xf] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_ + 0x40),local_4a80)
        ;
        *(undefined1 (*) [64])(pauVar61[-0xe] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_ + 0x80),local_4a40)
        ;
        *(undefined1 (*) [64])(pauVar61[-0xd] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_ + 0xc0),local_4a00)
        ;
        *(undefined1 (*) [64])(pauVar61[-0xc] + local_6280.m_cols * 8) = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < lVar56)) || (uVar63 < uVar1))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = uVar63 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67),local_4bc0);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67),local_4ac0);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-0xb] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 8),local_4b80);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 8),local_4a80);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-10] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x10),local_4b40
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x10),local_4a40
                                );
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-9] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x18),local_4b00
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x18),local_4a00
                                );
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-8] + local_6280.m_cols * 8) = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < lVar56)) || (uVar63 < uVar50))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = uVar63 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67),local_4cc0);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67),
                                 local_4ac0);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-7] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 8),local_4c80);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 8),
                                 local_4a80);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-6] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x10),local_4c40
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x10),
                                 local_4a40);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-5] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x18),local_4c00
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x18),
                                 local_4a00);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-4] + local_6280.m_cols * 8) = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < (long)uVar1)) || (uVar63 < uVar50))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = uVar63 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67),local_4cc0);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67),
                                 local_4bc0);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-3] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 8),local_4c80);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 8),
                                 local_4b80);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-2] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x10),local_4c40
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x10),
                                 local_4b40);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-1] + local_6280.m_cols * 8) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x18),local_4c00
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x18),
                                 local_4b00);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(*pauVar61 + local_6280.m_cols * 8) = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (lVar67 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar67 < (long)uVar50)) ||
           ((ulong)local_6280.m_rows <= lVar64 + 2U)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = lVar67 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])((long)pdVar51 + lVar67 * 8 + local_6228),
                                 local_49c0);
        *(undefined1 (*) [64])(pauVar61[-0x17] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_6228 + 0x40),local_4980);
        *(undefined1 (*) [64])(pauVar61[-0x16] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_6228 + 0x80),local_4940);
        *(undefined1 (*) [64])(pauVar61[-0x15] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_6228 + 0xc0),local_4900);
        *(undefined1 (*) [64])(pauVar61[-0x14] + lVar49) = auVar74;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar65) ||
           (lVar67 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar67 < (long)uVar1)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = lVar67 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_),local_48c0);
        *(undefined1 (*) [64])(pauVar61[-0x13] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_ + 0x40),local_4880)
        ;
        *(undefined1 (*) [64])(pauVar61[-0x12] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_ + 0x80),local_4840)
        ;
        *(undefined1 (*) [64])(pauVar61[-0x11] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5cc0._0_8_ + 0xc0),local_4800)
        ;
        *(undefined1 (*) [64])(pauVar61[-0x10] + lVar49) = auVar74;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar65) ||
           (lVar67 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar67 < lVar56)) goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = lVar67 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_),local_47c0);
        *(undefined1 (*) [64])(pauVar61[-0xf] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_ + 0x40),local_4780)
        ;
        *(undefined1 (*) [64])(pauVar61[-0xe] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_ + 0x80),local_4740)
        ;
        *(undefined1 (*) [64])(pauVar61[-0xd] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar51 + lVar67 * 8 + local_5d00._0_8_ + 0xc0),local_4700)
        ;
        *(undefined1 (*) [64])(pauVar61[-0xc] + lVar49) = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < lVar56)) || (uVar63 < uVar1))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = uVar63 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67),local_48c0);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67),local_47c0);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-0xb] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 8),local_4880);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 8),local_4780);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-10] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x10),local_4840
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x10),local_4740
                                );
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-9] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x18),local_4800
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x18),local_4700
                                );
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-8] + lVar49) = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < lVar56)) || (uVar63 < uVar50))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = uVar63 * lVar65;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67),local_49c0);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67),
                                 local_47c0);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-7] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 8),local_4980);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 8),
                                 local_4780);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-6] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x10),local_4940
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x10),
                                 local_4740);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-5] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar70 + lVar67 + 0x18),local_4900
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x18),
                                 local_4700);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-4] + lVar49) = auVar74;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar63 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar63 < (long)uVar1)) || (uVar63 < uVar50))
        goto LAB_00778d93;
        pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar67 = uVar63 * lVar65;
        lVar64 = lVar64 + 3;
        lVar65 = lVar65 + 1;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67),local_49c0);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67),
                                 local_48c0);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-3] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 8),local_4980);
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 8),
                                 local_4880);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-2] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x10),local_4940
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x10),
                                 local_4840);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(pauVar61[-1] + lVar49) = auVar74;
        auVar74 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + lVar68 + lVar67 + 0x18),local_4900
                                );
        auVar72 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar51 + local_5e40._0_8_ + lVar67 + 0x18),
                                 local_4800);
        auVar74 = vaddpd_avx512f(auVar74,auVar72);
        *(undefined1 (*) [64])(*pauVar61 + lVar49) = auVar74;
        pauVar61 = (undefined1 (*) [64])(*pauVar61 + local_6280.m_cols * 0x18);
      } while (lVar64 != 0x30);
      pLVar58 = (this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar49 = (long)pLVar58[(long)dVar55].m_material.
                     super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
      this_00 = (ChElementShellANCF_3443 *)
                pLVar58[(long)dVar55].m_material.
                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 == (ChElementShellANCF_3443 *)0x0) {
        this_00 = (ChElementShellANCF_3443 *)local_6080;
        memcpy(this_00,(void *)(lVar49 + 0x20),0x120);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar47 = (ChKblockGeneric *)
                    ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
          *(int *)&(pCVar47->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar47->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar47 = (ChKblockGeneric *)
                    ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
          *(int *)&(pCVar47->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar47->super_ChKblock)._vptr_ChKblock + 1;
        }
        memcpy(local_6080,(void *)(lVar49 + 0x20),0x120);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        pLVar58 = (this->m_layers).
                  super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      RotateReorderStiffnessMatrix
                (this_00,(ChMatrixNM<double,_6,_6> *)local_6080,pLVar58[(long)dVar55].m_theta);
      local_6260.m_cols = 0;
      local_6260.m_data = (double *)0x0;
      local_6260.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_6260,0x2400,0x30,0xc0);
      auVar73 = local_5e00;
      auVar72 = _local_5f40;
      auVar74 = _local_6180;
      if ((((((local_6280.m_rows < 0x30) || (local_6280.m_cols < 0x20)) ||
            ((ulong)local_6280.m_cols < 0x40)) ||
           (((ulong)local_6280.m_cols < 0x60 || ((ulong)local_6280.m_cols < 0x80)))) ||
          ((ulong)local_6280.m_cols < 0xa0)) || ((ulong)local_6280.m_cols < 0xc0)) {
LAB_00778dcc:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 48, 32>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 48, BlockCols = 32, InnerPanel = false]"
        ;
        goto LAB_00778dbf;
      }
      local_6180._0_8_ = local_6260.m_data;
      local_6180._0_24_ = CONCAT816(&local_6260,local_6180._0_16_);
      _local_6180 = ZEXT2440(local_6180._0_24_);
      auStack_6150 = auVar74._48_16_;
      dStack_6158 = (double)local_6260.m_cols;
      if ((local_6260.m_rows < 0x30) || (local_6260.m_cols < 0x20)) goto LAB_00778dcc;
      aTStack_31d0[0].m_matrix = (non_const_type)local_6080._0_8_;
      local_31c0 = local_6280.m_data;
      pdStack_3190 = local_6280.m_data + 0x20;
      pdStack_3160 = local_6280.m_data + 0x40;
      pdStack_3130 = local_6280.m_data + 0x60;
      local_3100 = local_6280.m_data + 0x80;
      pdStack_30d0 = local_6280.m_data + 0xa0;
      uStack_31b0 = local_6280.m_cols;
      psStack_31a0 = (pointer)local_6080._8_8_;
      local_5e00._0_8_ = local_6260.m_data;
      auVar74 = local_5e00;
      lVar49 = 0;
      local_5e00._24_40_ = auVar73._24_40_;
      local_5e00._0_16_ = auVar74._0_16_;
      local_5e00._16_8_ = local_6260.m_cols;
      local_3180 = local_6280.m_cols;
      psStack_3170 = (pointer)local_6080._16_8_;
      uStack_3150 = local_6280.m_cols;
      local_3140 = (ChLoadableUV)local_6080._24_8_;
      uStack_3120 = local_6280.m_cols;
      CStack_3110 = (ChLoadableUVW)local_6080._32_8_;
      uStack_30f0 = local_6280.m_cols;
      pLStack_30e0 = (pointer)local_6080._40_8_;
      local_30c0 = local_6280.m_cols;
      local_5f40._8_8_ = local_3200;
      local_5f40._0_8_ = local_5e00;
      puStack_5f30 = local_5c00;
      auStack_5f20 = auVar72._32_32_;
      pDStack_5f28 = (DstXprType *)local_6180;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_5f40,lVar49);
        auVar73 = local_5e00;
        auVar72 = _local_5f40;
        auVar74 = _local_6180;
        lVar49 = lVar49 + 1;
      } while (lVar49 != 0x30);
      if ((((local_6280.m_rows < 0x30) || (local_6280.m_cols < 0x20)) ||
          ((ulong)local_6280.m_cols < 0x40)) ||
         ((((ulong)local_6280.m_cols < 0x60 || ((ulong)local_6280.m_cols < 0x80)) ||
          (((ulong)local_6280.m_cols < 0xa0 || ((ulong)local_6280.m_cols < 0xc0))))))
      goto LAB_00778dcc;
      local_6180._0_8_ = local_6260.m_data + 0x20;
      local_6180._16_8_ = &local_6260;
      local_6180._24_8_ = 0;
      uStack_6160 = 0x20;
      auStack_6150 = auVar74._48_16_;
      dStack_6158 = (double)local_6260.m_cols;
      if ((local_6260.m_rows < 0x30) || (local_6260.m_cols < 0x40)) goto LAB_00778dcc;
      aTStack_31d0[0].m_matrix = (non_const_type)local_6080._48_8_;
      local_31c0 = local_6280.m_data;
      pdStack_3190 = local_6280.m_data + 0x20;
      pdStack_3160 = local_6280.m_data + 0x40;
      pdStack_3130 = local_6280.m_data + 0x60;
      local_3100 = local_6280.m_data + 0x80;
      pdStack_30d0 = local_6280.m_data + 0xa0;
      uStack_31b0 = local_6280.m_cols;
      psStack_31a0 = (pointer)local_6080._56_8_;
      local_5e00._0_8_ = local_6260.m_data + 0x20;
      auVar74 = local_5e00;
      lVar49 = 0;
      local_5e00._24_40_ = auVar73._24_40_;
      local_5e00._0_16_ = auVar74._0_16_;
      local_5e00._16_8_ = local_6260.m_cols;
      local_3180 = local_6280.m_cols;
      psStack_3170 = (pointer)local_6080._64_8_;
      uStack_3150 = local_6280.m_cols;
      local_3140 = (ChLoadableUV)local_6080._72_8_;
      uStack_3120 = local_6280.m_cols;
      CStack_3110 = (ChLoadableUVW)local_6080._80_8_;
      uStack_30f0 = local_6280.m_cols;
      pLStack_30e0 = (pointer)local_6080._88_8_;
      local_30c0 = local_6280.m_cols;
      local_5f40._0_8_ = local_5e00;
      puStack_5f30 = local_5c00;
      auStack_5f20 = auVar72._32_32_;
      pDStack_5f28 = (DstXprType *)local_6180;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_5f40,lVar49);
        auVar73 = local_5e00;
        auVar72 = _local_5f40;
        auVar74 = _local_6180;
        lVar49 = lVar49 + 1;
      } while (lVar49 != 0x30);
      if ((((local_6280.m_rows < 0x30) || (local_6280.m_cols < 0x20)) ||
          ((ulong)local_6280.m_cols < 0x40)) ||
         ((((ulong)local_6280.m_cols < 0x60 || ((ulong)local_6280.m_cols < 0x80)) ||
          (((ulong)local_6280.m_cols < 0xa0 || ((ulong)local_6280.m_cols < 0xc0))))))
      goto LAB_00778dcc;
      local_6180._0_8_ = local_6260.m_data + 0x40;
      local_6180._24_8_ = 0;
      uStack_6160 = 0x40;
      auStack_6150 = auVar74._48_16_;
      dStack_6158 = (double)local_6260.m_cols;
      if ((local_6260.m_rows < 0x30) || (local_6260.m_cols < 0x60)) goto LAB_00778dcc;
      aTStack_31d0[0].m_matrix = local_6020;
      local_31c0 = local_6280.m_data;
      pdStack_3190 = local_6280.m_data + 0x20;
      pdStack_3160 = local_6280.m_data + 0x40;
      pdStack_3130 = local_6280.m_data + 0x60;
      local_3100 = local_6280.m_data + 0x80;
      pdStack_30d0 = local_6280.m_data + 0xa0;
      uStack_31b0 = local_6280.m_cols;
      psStack_31a0 = local_6018;
      local_5e00._0_8_ = local_6260.m_data + 0x40;
      auVar74 = local_5e00;
      lVar49 = 0;
      local_5e00._24_40_ = auVar73._24_40_;
      local_5e00._0_16_ = auVar74._0_16_;
      local_5e00._16_8_ = local_6260.m_cols;
      local_3180 = local_6280.m_cols;
      psStack_3170 = local_6010;
      uStack_3150 = local_6280.m_cols;
      local_3140 = local_6008;
      uStack_3120 = local_6280.m_cols;
      CStack_3110 = local_6000;
      uStack_30f0 = local_6280.m_cols;
      pLStack_30e0 = local_5ff8;
      local_30c0 = local_6280.m_cols;
      local_5f40._0_8_ = local_5e00;
      puStack_5f30 = local_5c00;
      auStack_5f20 = auVar72._32_32_;
      pDStack_5f28 = (DstXprType *)local_6180;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_5f40,lVar49);
        auVar73 = local_5e00;
        auVar72 = _local_5f40;
        auVar74 = _local_6180;
        lVar49 = lVar49 + 1;
      } while (lVar49 != 0x30);
      if (((((local_6280.m_rows < 0x30) || (local_6280.m_cols < 0x20)) ||
           ((ulong)local_6280.m_cols < 0x40)) ||
          (((ulong)local_6280.m_cols < 0x60 || ((ulong)local_6280.m_cols < 0x80)))) ||
         (((ulong)local_6280.m_cols < 0xa0 || ((ulong)local_6280.m_cols < 0xc0))))
      goto LAB_00778dcc;
      local_6180._0_8_ = local_6260.m_data + 0x60;
      local_6180._24_8_ = 0;
      uStack_6160 = 0x60;
      auStack_6150 = auVar74._48_16_;
      dStack_6158 = (double)local_6260.m_cols;
      if ((local_6260.m_rows < 0x30) || (local_6260.m_cols < 0x80)) goto LAB_00778dcc;
      aTStack_31d0[0].m_matrix = local_5ff0;
      local_31c0 = local_6280.m_data;
      pdStack_3190 = local_6280.m_data + 0x20;
      pdStack_3160 = local_6280.m_data + 0x40;
      pdStack_3130 = local_6280.m_data + 0x60;
      local_3100 = local_6280.m_data + 0x80;
      pdStack_30d0 = local_6280.m_data + 0xa0;
      uStack_31b0 = local_6280.m_cols;
      psStack_31a0 = local_5fe8;
      local_5e00._0_8_ = local_6260.m_data + 0x60;
      auVar74 = local_5e00;
      lVar49 = 0;
      local_5e00._24_40_ = auVar73._24_40_;
      local_5e00._0_16_ = auVar74._0_16_;
      local_5e00._16_8_ = local_6260.m_cols;
      local_3180 = local_6280.m_cols;
      psStack_3170 = local_5fe0;
      uStack_3150 = local_6280.m_cols;
      local_3140 = local_5fd8;
      uStack_3120 = local_6280.m_cols;
      CStack_3110 = local_5fd0;
      uStack_30f0 = local_6280.m_cols;
      pLStack_30e0 = local_5fc8;
      local_30c0 = local_6280.m_cols;
      local_5f40._0_8_ = local_5e00;
      puStack_5f30 = local_5c00;
      auStack_5f20 = auVar72._32_32_;
      pDStack_5f28 = (DstXprType *)local_6180;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_5f40,lVar49);
        auVar73 = local_5e00;
        auVar72 = _local_5f40;
        auVar74 = _local_6180;
        lVar49 = lVar49 + 1;
      } while (lVar49 != 0x30);
      if ((((local_6280.m_rows < 0x30) || (local_6280.m_cols < 0x20)) ||
          ((ulong)local_6280.m_cols < 0x40)) ||
         ((((ulong)local_6280.m_cols < 0x60 || ((ulong)local_6280.m_cols < 0x80)) ||
          (((ulong)local_6280.m_cols < 0xa0 || ((ulong)local_6280.m_cols < 0xc0))))))
      goto LAB_00778dcc;
      local_6180._0_8_ = local_6260.m_data + 0x80;
      local_6180._24_8_ = 0;
      uStack_6160 = 0x80;
      auStack_6150 = auVar74._48_16_;
      dStack_6158 = (double)local_6260.m_cols;
      if ((local_6260.m_rows < 0x30) || (local_6260.m_cols < 0xa0)) goto LAB_00778dcc;
      aTStack_31d0[0].m_matrix = local_5fc0;
      local_31c0 = local_6280.m_data;
      pdStack_3190 = local_6280.m_data + 0x20;
      pdStack_3160 = local_6280.m_data + 0x40;
      pdStack_3130 = local_6280.m_data + 0x60;
      local_3100 = local_6280.m_data + 0x80;
      pdStack_30d0 = local_6280.m_data + 0xa0;
      uStack_31b0 = local_6280.m_cols;
      psStack_31a0 = local_5fb8;
      local_5e00._0_8_ = local_6260.m_data + 0x80;
      auVar74 = local_5e00;
      lVar49 = 0;
      local_5e00._24_40_ = auVar73._24_40_;
      local_5e00._0_16_ = auVar74._0_16_;
      local_5e00._16_8_ = local_6260.m_cols;
      local_3180 = local_6280.m_cols;
      psStack_3170 = local_5fb0;
      uStack_3150 = local_6280.m_cols;
      local_3140 = local_5fa8;
      uStack_3120 = local_6280.m_cols;
      CStack_3110 = local_5fa0;
      uStack_30f0 = local_6280.m_cols;
      pLStack_30e0 = local_5f98;
      local_30c0 = local_6280.m_cols;
      local_5f40._0_8_ = local_5e00;
      puStack_5f30 = local_5c00;
      auStack_5f20 = auVar72._32_32_;
      pDStack_5f28 = (DstXprType *)local_6180;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_5f40,lVar49);
        auVar73 = local_5e00;
        auVar72 = _local_5f40;
        auVar74 = _local_6180;
        lVar49 = lVar49 + 1;
      } while (lVar49 != 0x30);
      if ((((local_6280.m_rows < 0x30) || (local_6280.m_cols < 0x20)) ||
          ((ulong)local_6280.m_cols < 0x40)) ||
         ((((ulong)local_6280.m_cols < 0x60 || ((ulong)local_6280.m_cols < 0x80)) ||
          (((ulong)local_6280.m_cols < 0xa0 || ((ulong)local_6280.m_cols < 0xc0))))))
      goto LAB_00778dcc;
      local_6180._0_8_ = local_6260.m_data + 0xa0;
      local_6180._24_8_ = 0;
      uStack_6160 = 0xa0;
      auStack_6150 = auVar74._48_16_;
      dStack_6158 = (double)local_6260.m_cols;
      if ((local_6260.m_rows < 0x30) || (local_6260.m_cols < 0xc0)) goto LAB_00778dcc;
      aTStack_31d0[0].m_matrix = local_5f90;
      local_31c0 = local_6280.m_data;
      pdStack_3190 = local_6280.m_data + 0x20;
      pdStack_3160 = local_6280.m_data + 0x40;
      pdStack_3130 = local_6280.m_data + 0x60;
      local_3100 = local_6280.m_data + 0x80;
      pdStack_30d0 = local_6280.m_data + 0xa0;
      uStack_31b0 = local_6280.m_cols;
      psStack_31a0 = local_5f88;
      local_5e00._0_8_ = local_6260.m_data + 0xa0;
      auVar74 = local_5e00;
      local_5e00._24_40_ = auVar73._24_40_;
      local_5e00._0_16_ = auVar74._0_16_;
      local_5e00._16_8_ = local_6260.m_cols;
      lVar49 = 0;
      local_3180 = local_6280.m_cols;
      psStack_3170 = local_5f80;
      uStack_3150 = local_6280.m_cols;
      local_3140 = local_5f78;
      uStack_3120 = local_6280.m_cols;
      CStack_3110 = local_5f70;
      uStack_30f0 = local_6280.m_cols;
      pLStack_30e0 = local_5f68;
      local_30c0 = local_6280.m_cols;
      local_5f40._0_8_ = local_5e00;
      uVar48 = local_5c80._0_8_;
      puStack_5f30 = local_5c00;
      auStack_5f20 = auVar72._32_32_;
      pDStack_5f28 = (DstXprType *)local_6180;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_5f40,lVar49);
        lVar49 = lVar49 + 1;
      } while (lVar49 != 0x30);
      if (local_6220._16_8_ != local_6260.m_cols) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Option = 0]"
                     );
      }
      local_3200 = (undefined1  [8])local_6220;
      TStack_31f8.m_matrix = (non_const_type)&local_6260;
      if (((local_6240->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value != local_6220._8_8_) ||
         ((local_6240->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value != local_6260.m_rows)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,
                      "static void Eigen::internal::Assignment<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, SrcXprType = Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                     );
      }
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                (local_6240,(Matrix<double,__1,__1,_1,__1,__1> *)local_6220,&TStack_31f8);
      auVar77._8_8_ = local_58c0._8_8_;
      auVar77._0_8_ = local_58c0._0_8_;
      auVar77._16_8_ = local_58c0._16_8_;
      auVar77._24_40_ = local_58c0._24_40_;
      auVar74 = vmulpd_avx512f(auVar77,auVar77);
      auVar72 = vmulpd_avx512f(local_55c0,local_55c0);
      auVar73 = vmulpd_avx512f(local_5880,local_5880);
      auVar75 = vmulpd_avx512f(local_5840,local_5840);
      auVar74 = vaddpd_avx512f(auVar74,auVar72);
      auVar72 = vmulpd_avx512f(local_52c0,local_52c0);
      auVar74 = vaddpd_avx512f(auVar74,auVar72);
      auVar72 = vmulpd_avx512f(local_5580,local_5580);
      auVar72 = vaddpd_avx512f(auVar73,auVar72);
      auVar73 = vmulpd_avx512f(local_5280,local_5280);
      auVar72 = vaddpd_avx512f(auVar72,auVar73);
      auVar73 = vmulpd_avx512f(local_5540,local_5540);
      auVar73 = vaddpd_avx512f(auVar75,auVar73);
      auVar75 = vmulpd_avx512f(local_5240,local_5240);
      auVar76 = vmulpd_avx512f(local_5800,local_5800);
      auVar77 = vmulpd_avx512f(local_5500,local_5500);
      auVar73 = vaddpd_avx512f(auVar73,auVar75);
      auVar75 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
      auVar76 = vaddpd_avx512f(auVar76,auVar77);
      auVar77 = vmulpd_avx512f(local_5200,local_5200);
      auVar76 = vaddpd_avx512f(auVar76,auVar77);
      _local_6180 = vaddpd_avx512f(auVar74,auVar75);
      local_6140 = vaddpd_avx512f(auVar72,auVar75);
      local_6100 = vaddpd_avx512f(auVar73,auVar75);
      local_60c0 = vaddpd_avx512f(auVar76,auVar75);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)uVar48) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) {
LAB_00778de3:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 32, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00778dbf;
      }
      auVar74 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
      TStack_31f8.m_matrix =
           (non_const_type)
           ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
            .m_data + (long)dVar55 * 0x20);
      auVar72 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      auVar73 = vmulpd_avx512f(auVar72,*(undefined1 (*) [64])TStack_31f8.m_matrix);
      _local_6180 = vmulpd_avx512f(_local_6180,auVar73);
      auVar73 = vmulpd_avx512f(auVar72,*(undefined1 (*) [64])
                                        &((DenseStorage<double,__1,__1,__1,_1> *)
                                         TStack_31f8.m_matrix)[2].m_cols);
      local_6140 = vmulpd_avx512f(local_6140,auVar73);
      auVar73 = vmulpd_avx512f(auVar72,*(undefined1 (*) [64])
                                        &((DenseStorage<double,__1,__1,__1,_1> *)
                                         TStack_31f8.m_matrix)[5].m_rows);
      auVar75 = vmulpd_avx512f(local_5700,local_5700);
      local_6100 = vmulpd_avx512f(local_6100,auVar73);
      auVar72 = vmulpd_avx512f(auVar72,*(undefined1 (*) [64])
                                        ((DenseStorage<double,__1,__1,__1,_1> *)TStack_31f8.m_matrix
                                        + 8));
      auVar73 = vmulpd_avx512f(local_5740,local_5740);
      local_60c0 = vmulpd_avx512f(local_60c0,auVar72);
      auVar72 = vmulpd_avx512f(local_57c0,local_57c0);
      auVar76 = vmulpd_avx512f(local_5780,local_5780);
      auVar77 = vmulpd_avx512f(local_54c0,local_54c0);
      auVar72 = vaddpd_avx512f(auVar72,auVar77);
      auVar77 = vmulpd_avx512f(local_51c0,local_51c0);
      auVar72 = vaddpd_avx512f(auVar72,auVar77);
      auVar77 = vmulpd_avx512f(local_5480,local_5480);
      auVar76 = vaddpd_avx512f(auVar76,auVar77);
      auVar72 = vaddpd_avx512f(auVar72,auVar74);
      auVar77 = vmulpd_avx512f(local_5180,local_5180);
      auVar76 = vaddpd_avx512f(auVar76,auVar77);
      auVar77 = vmulpd_avx512f(local_5440,local_5440);
      auVar73 = vaddpd_avx512f(auVar73,auVar77);
      auVar76 = vaddpd_avx512f(auVar76,auVar74);
      auVar77 = vmulpd_avx512f(local_5140,local_5140);
      auVar73 = vaddpd_avx512f(auVar73,auVar77);
      auVar77 = vmulpd_avx512f(local_5400,local_5400);
      auVar75 = vaddpd_avx512f(auVar75,auVar77);
      auVar73 = vaddpd_avx512f(auVar73,auVar74);
      auVar77 = vmulpd_avx512f(local_5100,local_5100);
      auVar75 = vaddpd_avx512f(auVar75,auVar77);
      auVar77 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      auVar75 = vaddpd_avx512f(auVar75,auVar74);
      auVar78 = vmulpd_avx512f(auVar77,*(undefined1 (*) [64])TStack_31f8.m_matrix);
      _local_5f40 = vmulpd_avx512f(auVar72,auVar78);
      auVar72 = vmulpd_avx512f(local_53c0,local_53c0);
      auVar78 = vmulpd_avx512f(auVar77,*(undefined1 (*) [64])
                                        &((DenseStorage<double,__1,__1,__1,_1> *)
                                         TStack_31f8.m_matrix)[2].m_cols);
      local_5f00 = vmulpd_avx512f(auVar76,auVar78);
      auVar76 = vmulpd_avx512f(auVar77,*(undefined1 (*) [64])
                                        &((DenseStorage<double,__1,__1,__1,_1> *)
                                         TStack_31f8.m_matrix)[5].m_rows);
      local_5ec0 = vmulpd_avx512f(auVar73,auVar76);
      auVar73 = vmulpd_avx512f(local_56c0,local_56c0);
      auVar72 = vaddpd_avx512f(auVar73,auVar72);
      auVar73 = vmulpd_avx512f(local_5380,local_5380);
      auVar76 = vmulpd_avx512f(auVar77,*(undefined1 (*) [64])
                                        ((DenseStorage<double,__1,__1,__1,_1> *)TStack_31f8.m_matrix
                                        + 8));
      auVar77 = vmulpd_avx512f(local_50c0,local_50c0);
      local_3200 = (undefined1  [8])0x3fe0000000000000;
      auVar72 = vaddpd_avx512f(auVar72,auVar77);
      auVar77 = vmulpd_avx512f(local_5680,local_5680);
      auVar78 = vmulpd_avx512f(local_5080,local_5080);
      auVar73 = vaddpd_avx512f(auVar77,auVar73);
      auVar72 = vaddpd_avx512f(auVar72,auVar74);
      auVar73 = vaddpd_avx512f(auVar73,auVar78);
      auVar77 = vmulpd_avx512f(local_5640,local_5640);
      local_5e80 = vmulpd_avx512f(auVar75,auVar76);
      auVar73 = vaddpd_avx512f(auVar73,auVar74);
      auVar75 = vmulpd_avx512f(local_5340,local_5340);
      auVar75 = vaddpd_avx512f(auVar77,auVar75);
      auVar76 = vmulpd_avx512f(local_5600,local_5600);
      auVar77 = vmulpd_avx512f(local_5040,local_5040);
      auVar75 = vaddpd_avx512f(auVar75,auVar77);
      auVar75 = vaddpd_avx512f(auVar75,auVar74);
      auVar77 = vmulpd_avx512f(local_5300,local_5300);
      auVar76 = vaddpd_avx512f(auVar76,auVar77);
      auVar77 = vmulpd_avx512f(local_5000,local_5000);
      auVar76 = vaddpd_avx512f(auVar76,auVar77);
      auVar77 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      auVar74 = vaddpd_avx512f(auVar76,auVar74);
      auVar76 = vmulpd_avx512f(auVar77,*(undefined1 (*) [64])TStack_31f8.m_matrix);
      local_5e00 = vmulpd_avx512f(auVar72,auVar76);
      auVar72 = vmulpd_avx512f(auVar77,*(undefined1 (*) [64])
                                        &((DenseStorage<double,__1,__1,__1,_1> *)
                                         TStack_31f8.m_matrix)[2].m_cols);
      local_5dc0 = vmulpd_avx512f(auVar73,auVar72);
      auVar72 = vmulpd_avx512f(auVar77,*(undefined1 (*) [64])
                                        &((DenseStorage<double,__1,__1,__1,_1> *)
                                         TStack_31f8.m_matrix)[5].m_rows);
      local_5d80 = vmulpd_avx512f(auVar75,auVar72);
      auVar72 = vmulpd_avx512f(auVar77,*(undefined1 (*) [64])
                                        ((DenseStorage<double,__1,__1,__1,_1> *)TStack_31f8.m_matrix
                                        + 8));
      local_5d40 = vmulpd_avx512f(auVar74,auVar72);
      auVar74 = vmulpd_avx512f(local_57c0,local_56c0);
      auVar72 = vmulpd_avx512f(local_54c0,local_53c0);
      auVar74 = vaddpd_avx512f(auVar74,auVar72);
      auVar72 = vmulpd_avx512f(local_51c0,local_50c0);
      local_5c00 = vaddpd_avx512f(auVar74,auVar72);
      auVar74 = vmulpd_avx512f(local_5780,local_5680);
      auVar72 = vmulpd_avx512f(local_5480,local_5380);
      auVar74 = vaddpd_avx512f(auVar74,auVar72);
      auVar72 = vmulpd_avx512f(local_5180,local_5080);
      local_5bc0 = vaddpd_avx512f(auVar74,auVar72);
      auVar74 = vmulpd_avx512f(local_5740,local_5640);
      auVar72 = vmulpd_avx512f(local_5440,local_5340);
      auVar74 = vaddpd_avx512f(auVar74,auVar72);
      auVar72 = vmulpd_avx512f(local_5140,local_5040);
      local_5b80 = vaddpd_avx512f(auVar74,auVar72);
      auVar74 = vmulpd_avx512f(local_5700,local_5600);
      auVar72 = vmulpd_avx512f(local_5400,local_5300);
      auVar74 = vaddpd_avx512f(auVar74,auVar72);
      auVar72 = vmulpd_avx512f(local_5100,local_5000);
      local_5b40 = vaddpd_avx512f(auVar74,auVar72);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)uVar48) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00778de3;
      pdVar51 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      auVar74 = vmulpd_avx512f(local_5580,local_5380);
      local_5c00 = vmulpd_avx512f(local_5c00,*(undefined1 (*) [64])(pdVar51 + (long)dVar55 * 0x20));
      auVar72 = vmulpd_avx512f(local_5540,local_5340);
      auVar73 = vmulpd_avx512f(local_5800,local_5600);
      auVar75 = vmulpd_avx512f(local_5500,local_5300);
      auVar76 = vmulpd_avx512f(local_5240,local_5040);
      auVar77 = vmulpd_avx512f(local_5200,local_5000);
      auVar73 = vaddpd_avx512f(auVar73,auVar75);
      auVar75 = vmulpd_avx512f(local_5200,local_5100);
      auVar73 = vaddpd_avx512f(auVar73,auVar77);
      local_5bc0 = vmulpd_avx512f(local_5bc0,
                                  *(undefined1 (*) [64])(pdVar51 + (long)dVar55 * 0x20 + 8));
      local_5b80 = vmulpd_avx512f(local_5b80,
                                  *(undefined1 (*) [64])(pdVar51 + (long)dVar55 * 0x20 + 0x10));
      local_5b40 = vmulpd_avx512f(local_5b40,
                                  *(undefined1 (*) [64])(pdVar51 + (long)dVar55 * 0x20 + 0x18));
      auVar77 = vmulpd_avx512f(local_55c0,local_53c0);
      auVar78._8_8_ = local_58c0._8_8_;
      auVar78._0_8_ = local_58c0._0_8_;
      auVar78._16_8_ = local_58c0._16_8_;
      auVar78._24_40_ = local_58c0._24_40_;
      auVar79 = vmulpd_avx512f(auVar78,local_56c0);
      auVar77 = vaddpd_avx512f(auVar79,auVar77);
      auVar79 = vmulpd_avx512f(local_52c0,local_50c0);
      auVar77 = vaddpd_avx512f(auVar77,auVar79);
      auVar79 = vmulpd_avx512f(local_5880,local_5680);
      auVar74 = vaddpd_avx512f(auVar79,auVar74);
      auVar79 = vmulpd_avx512f(local_5280,local_5080);
      auVar74 = vaddpd_avx512f(auVar74,auVar79);
      auVar79 = vmulpd_avx512f(local_5840,local_5640);
      auVar72 = vaddpd_avx512f(auVar79,auVar72);
      auVar79 = vmulpd_avx512f(local_5240,local_5140);
      auVar72 = vaddpd_avx512f(auVar72,auVar76);
      auVar76 = vmulpd_avx512f(local_5500,local_5400);
      local_5a00 = vmulpd_avx512f(auVar77,*(undefined1 (*) [64])(pdVar51 + (long)dVar55 * 0x20));
      local_59c0 = vmulpd_avx512f(auVar74,*(undefined1 (*) [64])(pdVar51 + (long)dVar55 * 0x20 + 8))
      ;
      auVar74 = vmulpd_avx512f(auVar78,local_57c0);
      auVar77 = vmulpd_avx512f(local_5880,local_5780);
      auVar78 = vmulpd_avx512f(local_5840,local_5740);
      local_5980 = vmulpd_avx512f(auVar72,*(undefined1 (*) [64])
                                           (pdVar51 + (long)dVar55 * 0x20 + 0x10));
      auVar72 = vmulpd_avx512f(local_55c0,local_54c0);
      local_5940 = vmulpd_avx512f(auVar73,*(undefined1 (*) [64])
                                           (pdVar51 + (long)dVar55 * 0x20 + 0x18));
      auVar74 = vaddpd_avx512f(auVar74,auVar72);
      auVar72 = vmulpd_avx512f(local_52c0,local_51c0);
      auVar74 = vaddpd_avx512f(auVar74,auVar72);
      auVar72 = vmulpd_avx512f(local_5580,local_5480);
      auVar72 = vaddpd_avx512f(auVar77,auVar72);
      auVar73 = vmulpd_avx512f(local_5280,local_5180);
      auVar72 = vaddpd_avx512f(auVar72,auVar73);
      auVar73 = vmulpd_avx512f(local_5540,local_5440);
      auVar73 = vaddpd_avx512f(auVar78,auVar73);
      auVar77 = vmulpd_avx512f(local_5800,local_5700);
      auVar73 = vaddpd_avx512f(auVar73,auVar79);
      auVar76 = vaddpd_avx512f(auVar77,auVar76);
      auVar75 = vaddpd_avx512f(auVar76,auVar75);
      local_5b00 = vmulpd_avx512f(auVar74,*(undefined1 (*) [64])(pdVar51 + (long)dVar55 * 0x20));
      local_5ac0 = vmulpd_avx512f(auVar72,*(undefined1 (*) [64])(pdVar51 + (long)dVar55 * 0x20 + 8))
      ;
      local_5a80 = vmulpd_avx512f(auVar73,*(undefined1 (*) [64])
                                           (pdVar51 + (long)dVar55 * 0x20 + 0x10));
      local_5a40 = vmulpd_avx512f(auVar75,*(undefined1 (*) [64])
                                           (pdVar51 + (long)dVar55 * 0x20 + 0x18));
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_6080._32_8_;
      auVar74 = vbroadcastsd_avx512f(auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_6080._8_8_;
      auVar72 = vbroadcastsd_avx512f(auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_6080._40_8_;
      auVar73 = vbroadcastsd_avx512f(auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_6080._16_8_;
      auVar75 = vbroadcastsd_avx512f(auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_6080._0_8_;
      auVar76 = vbroadcastsd_avx512f(auVar10);
      local_5e40 = vmulpd_avx512f(auVar75,local_5e00);
      local_5d00 = vmulpd_avx512f(auVar74,local_5a00);
      local_5c40 = vmulpd_avx512f(auVar73,local_5b00);
      auVar77 = vmulpd_avx512f(auVar72,_local_5f40);
      auVar78 = vmulpd_avx512f(auVar73,local_5a40);
      auVar79 = vmulpd_avx512f(auVar76,_local_6180);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_6080._24_8_;
      auVar80 = vbroadcastsd_avx512f(auVar11);
      local_5c80 = vmulpd_avx512f(auVar76,local_6140);
      local_5900 = vmulpd_avx512f(auVar72,local_5f00);
      local_5cc0 = vmulpd_avx512f(auVar80,local_5c00);
      local_46c0 = vmulpd_avx512f(auVar75,local_5dc0);
      local_3240 = vmulpd_avx512f(auVar80,local_5bc0);
      local_3340 = vmulpd_avx512f(auVar72,local_5ec0);
      local_3280 = vmulpd_avx512f(auVar74,local_59c0);
      local_32c0 = vmulpd_avx512f(auVar73,local_5ac0);
      local_3380 = vmulpd_avx512f(auVar75,local_5d80);
      local_3300 = vmulpd_avx512f(auVar76,local_6100);
      local_34c0 = vmulpd_avx512f(auVar72,local_5e80);
      local_3480 = vmulpd_avx512f(auVar76,local_60c0);
      local_33c0 = vmulpd_avx512f(auVar80,local_5b80);
      local_3500 = vmulpd_avx512f(auVar75,local_5d40);
      local_3540 = vmulpd_avx512f(auVar80,local_5b40);
      local_3400 = vmulpd_avx512f(auVar74,local_5980);
      local_3580 = vmulpd_avx512f(auVar74,local_5940);
      local_3440 = vmulpd_avx512f(auVar73,local_5a80);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_6080._56_8_;
      auVar74 = vbroadcastsd_avx512f(auVar12);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_6080._64_8_;
      auVar72 = vbroadcastsd_avx512f(auVar13);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_6080._48_8_;
      auVar73 = vbroadcastsd_avx512f(auVar14);
      local_3600 = vmulpd_avx512f(auVar74,_local_5f40);
      local_35c0 = vmulpd_avx512f(auVar73,_local_6180);
      local_3640 = vmulpd_avx512f(auVar73,local_6140);
      local_3680 = vmulpd_avx512f(auVar74,local_5f00);
      local_37c0 = vmulpd_avx512f(auVar74,local_5ec0);
      local_3740 = vmulpd_avx512f(auVar74,local_5e80);
      local_36c0 = vmulpd_avx512f(auVar73,local_6100);
      local_3700 = vmulpd_avx512f(auVar73,local_60c0);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_6080._72_8_;
      auVar74 = vbroadcastsd_avx512f(auVar15);
      local_3940 = vmulpd_avx512f(auVar72,local_5e00);
      local_3880 = vmulpd_avx512f(auVar72,local_5dc0);
      local_38c0 = vmulpd_avx512f(auVar74,local_5b80);
      local_3840 = vmulpd_avx512f(auVar74,local_5b40);
      local_3800 = vmulpd_avx512f(auVar72,local_5d80);
      local_3780 = vmulpd_avx512f(auVar72,local_5d40);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_6080._80_8_;
      auVar72 = vbroadcastsd_avx512f(auVar16);
      local_3900 = vmulpd_avx512f(auVar72,local_5940);
      local_3a40 = vmulpd_avx512f(auVar74,local_5c00);
      local_3980 = vmulpd_avx512f(auVar74,local_5bc0);
      auVar74 = vmulpd_avx512f(auVar72,local_5a00);
      local_3a80 = vmulpd_avx512f(auVar72,local_59c0);
      local_39c0 = vmulpd_avx512f(auVar72,local_5980);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_6080._88_8_;
      auVar72 = vbroadcastsd_avx512f(auVar17);
      auVar73 = vmulpd_avx512f(auVar72,local_5ac0);
      auVar75 = vmulpd_avx512f(auVar72,local_5a80);
      local_3a00 = vmulpd_avx512f(auVar72,local_5a40);
      auVar72 = vmulpd_avx512f(auVar72,local_5b00);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_6020;
      auVar76 = vbroadcastsd_avx512f(auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_6008;
      auVar80 = vbroadcastsd_avx512f(auVar19);
      local_3ac0 = vmulpd_avx512f(auVar76,_local_6180);
      local_3b80 = vmulpd_avx512f(auVar76,local_60c0);
      local_3b00 = vmulpd_avx512f(auVar76,local_6140);
      local_3b40 = vmulpd_avx512f(auVar76,local_6100);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_6018;
      auVar76 = vbroadcastsd_avx512f(auVar20);
      local_3d40 = vmulpd_avx512f(auVar76,_local_5f40);
      local_3c40 = vmulpd_avx512f(auVar76,local_5ec0);
      local_3d00 = vmulpd_avx512f(auVar76,local_5f00);
      local_3bc0 = vmulpd_avx512f(auVar76,local_5e80);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_6010;
      auVar76 = vbroadcastsd_avx512f(auVar21);
      local_3f40 = vmulpd_avx512f(auVar80,local_5c00);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_6000;
      auVar81 = vbroadcastsd_avx512f(auVar22);
      local_3e40 = vmulpd_avx512f(auVar76,local_5e00);
      local_3d80 = vmulpd_avx512f(auVar76,local_5dc0);
      auVar82 = vmulpd_avx512f(auVar81,local_59c0);
      local_3c80 = vmulpd_avx512f(auVar76,local_5d80);
      local_3c00 = vmulpd_avx512f(auVar76,local_5d40);
      local_3e80 = vmulpd_avx512f(auVar80,local_5bc0);
      local_3dc0 = vmulpd_avx512f(auVar80,local_5b80);
      local_3cc0 = vmulpd_avx512f(auVar80,local_5b40);
      local_3ec0 = vmulpd_avx512f(auVar81,local_5980);
      local_3e00 = vmulpd_avx512f(auVar81,local_5940);
      auVar76 = vmulpd_avx512f(auVar81,local_5a00);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_5ff8;
      auVar80 = vbroadcastsd_avx512f(auVar23);
      local_3f80 = vmulpd_avx512f(auVar80,local_5a80);
      auVar81 = vmulpd_avx512f(auVar80,local_5ac0);
      auVar83 = vmulpd_avx512f(auVar80,local_5b00);
      local_3f00 = vmulpd_avx512f(auVar80,local_5a40);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_5fd8;
      auVar80 = vbroadcastsd_avx512f(auVar24);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_5ff0;
      auVar84 = vbroadcastsd_avx512f(auVar25);
      local_3fc0 = vmulpd_avx512f(auVar84,_local_6180);
      local_4080 = vmulpd_avx512f(auVar84,local_60c0);
      local_4000 = vmulpd_avx512f(auVar84,local_6140);
      local_4040 = vmulpd_avx512f(auVar84,local_6100);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_5fe8;
      auVar84 = vbroadcastsd_avx512f(auVar26);
      local_4240 = vmulpd_avx512f(auVar84,_local_5f40);
      local_4200 = vmulpd_avx512f(auVar84,local_5f00);
      local_4140 = vmulpd_avx512f(auVar84,local_5ec0);
      local_40c0 = vmulpd_avx512f(auVar84,local_5e80);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_5fe0;
      auVar84 = vbroadcastsd_avx512f(auVar27);
      local_4440 = vmulpd_avx512f(auVar80,local_5c00);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_5fd0;
      auVar85 = vbroadcastsd_avx512f(auVar28);
      local_4340 = vmulpd_avx512f(auVar84,local_5e00);
      local_4280 = vmulpd_avx512f(auVar84,local_5dc0);
      auVar86 = vmulpd_avx512f(auVar85,local_5a00);
      local_4180 = vmulpd_avx512f(auVar84,local_5d80);
      local_4100 = vmulpd_avx512f(auVar84,local_5d40);
      local_4380 = vmulpd_avx512f(auVar80,local_5bc0);
      local_42c0 = vmulpd_avx512f(auVar80,local_5b80);
      local_41c0 = vmulpd_avx512f(auVar80,local_5b40);
      local_43c0 = vmulpd_avx512f(auVar85,local_5980);
      local_4480 = vmulpd_avx512f(auVar85,local_59c0);
      local_4300 = vmulpd_avx512f(auVar85,local_5940);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_5fc8;
      auVar80 = vbroadcastsd_avx512f(auVar29);
      auVar84 = vmulpd_avx512f(auVar80,local_5a80);
      auVar85 = vmulpd_avx512f(auVar80,local_5b00);
      auVar87 = vmulpd_avx512f(auVar80,local_5ac0);
      local_4400 = vmulpd_avx512f(auVar80,local_5a40);
      auVar111._8_8_ = 0;
      auVar111._0_8_ = local_5f98;
      vmovsd_avx512f(auVar111);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_5fc0;
      auVar80 = vbroadcastsd_avx512f(auVar30);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_5fb8;
      auVar88 = vbroadcastsd_avx512f(auVar31);
      local_44c0 = vmulpd_avx512f(auVar80,_local_6180);
      local_4500 = vmulpd_avx512f(auVar80,local_6140);
      local_4580 = vmulpd_avx512f(auVar80,local_60c0);
      local_4540 = vmulpd_avx512f(auVar80,local_6100);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_5fa8;
      auVar80 = vbroadcastsd_avx512f(auVar32);
      auVar89 = vmulpd_avx512f(auVar80,local_5c00);
      auVar90 = vmulpd_avx512f(auVar80,local_5bc0);
      auVar91 = vmulpd_avx512f(auVar80,local_5b80);
      local_4640 = vmulpd_avx512f(auVar88,local_5ec0);
      auVar92 = vmulpd_avx512f(auVar88,_local_5f40);
      auVar93 = vmulpd_avx512f(auVar88,local_5f00);
      local_45c0 = vmulpd_avx512f(auVar88,local_5e80);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_5fb0;
      auVar88 = vbroadcastsd_avx512f(auVar33);
      auVar94 = vmulpd_avx512f(auVar88,local_5e00);
      auVar95 = vmulpd_avx512f(auVar88,local_5d80);
      auVar96 = vmulpd_avx512f(auVar88,local_5dc0);
      local_4600 = vmulpd_avx512f(auVar88,local_5d40);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_5fa0;
      auVar88 = vbroadcastsd_avx512f(auVar34);
      auVar97 = vmulpd_avx512f(auVar88,local_5a00);
      auVar98 = vmulpd_avx512f(auVar88,local_59c0);
      auVar99 = vmulpd_avx512f(auVar88,local_5980);
      local_4680 = vmulpd_avx512f(auVar80,local_5b40);
      auVar80 = vmulpd_avx512f(auVar88,local_5940);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_5fc8;
      auVar88 = vbroadcastsd_avx512f(auVar35);
      auVar100 = vmulpd_avx512f(auVar88,local_5ac0);
      auVar101 = vmulpd_avx512f(auVar88,local_5a80);
      auVar102 = vmulpd_avx512f(auVar88,local_5a40);
      auVar88 = vmulpd_avx512f(auVar88,local_5b00);
      auVar105._8_8_ = 0;
      auVar105._0_8_ = local_5f90;
      vmovsd_avx512f(auVar105);
      local_3200 = (undefined1  [8])local_5fc0;
      TStack_31f8.m_matrix = (non_const_type)local_6180;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = local_5f88;
      vmovsd_avx512f(auVar106);
      auVar107._8_8_ = 0;
      auVar107._0_8_ = local_5f80;
      vmovsd_avx512f(auVar107);
      auVar108._8_8_ = 0;
      auVar108._0_8_ = local_5f78;
      vmovsd_avx512f(auVar108);
      auVar109._8_8_ = 0;
      auVar109._0_8_ = local_5f70;
      vmovsd_avx512f(auVar109);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = local_5f68;
      vmovsd_avx512f(auVar110);
      dVar55 = (double)(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols;
      bVar52 = (long)dVar55 < (long)local_6200._0_8_;
      if ((long)dVar55 < (long)local_6200._0_8_) {
LAB_00778d93:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 32>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 32, InnerPanel = false]"
        ;
        goto LAB_00778dbf;
      }
      auVar77 = vaddpd_avx512f(auVar79,auVar77);
      auVar77 = vaddpd_avx512f(auVar77,local_5e40);
      auVar79 = vaddpd_avx512f(auVar92,local_44c0);
      auVar92 = vaddpd_avx512f(auVar93,local_4500);
      uVar50 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      pauVar61 = (undefined1 (*) [64])local_2f40;
      uVar63 = 0;
      auVar77 = vaddpd_avx512f(auVar77,local_5cc0);
      pdVar51 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data + 0x18;
      auVar77 = vaddpd_avx512f(auVar77,local_5d00);
      local_6200 = vaddpd_avx512f(auVar77,local_5c40);
      auVar77 = vaddpd_avx512f(auVar79,auVar94);
      auVar79 = vaddpd_avx512f(auVar92,auVar96);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_5fb0;
      auVar92 = vbroadcastsd_avx512f(auVar36);
      auVar93 = vaddpd_avx512f(local_4640,local_4540);
      auVar77 = vaddpd_avx512f(auVar77,auVar89);
      auVar79 = vaddpd_avx512f(auVar79,auVar90);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_5fa0;
      auVar89 = vbroadcastsd_avx512f(auVar37);
      auVar77 = vaddpd_avx512f(auVar77,auVar97);
      auVar79 = vaddpd_avx512f(auVar79,auVar98);
      auVar90 = vaddpd_avx512f(local_5900,local_5c80);
      auVar77 = vaddpd_avx512f(auVar77,auVar88);
      auVar79 = vaddpd_avx512f(auVar79,auVar100);
      auVar88 = vaddpd_avx512f(auVar93,auVar95);
      auVar90 = vaddpd_avx512f(auVar90,local_46c0);
      auVar88 = vaddpd_avx512f(auVar88,auVar91);
      auVar90 = vaddpd_avx512f(auVar90,local_3240);
      auVar88 = vaddpd_avx512f(auVar88,auVar99);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_5fc8;
      auVar91 = vbroadcastsd_avx512f(auVar38);
      auVar90 = vaddpd_avx512f(auVar90,local_3280);
      auVar88 = vaddpd_avx512f(auVar88,auVar101);
      local_5e40 = vaddpd_avx512f(auVar90,local_32c0);
      auVar90 = vaddpd_avx512f(local_3340,local_3300);
      auVar90 = vaddpd_avx512f(auVar90,local_3380);
      auVar90 = vaddpd_avx512f(auVar90,local_33c0);
      auVar90 = vaddpd_avx512f(auVar90,local_3400);
      local_5cc0 = vaddpd_avx512f(auVar90,local_3440);
      auVar90 = vaddpd_avx512f(local_34c0,local_3480);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_5fb8;
      auVar93 = vbroadcastsd_avx512f(auVar39);
      auVar94 = vmulpd_avx512f(auVar93,local_5f00);
      auVar90 = vaddpd_avx512f(auVar90,local_3500);
      auVar90 = vaddpd_avx512f(auVar90,local_3540);
      auVar90 = vaddpd_avx512f(auVar90,local_3580);
      local_5d00 = vaddpd_avx512f(auVar90,auVar78);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_5fa8;
      auVar78 = vbroadcastsd_avx512f(auVar40);
      auVar90 = vaddpd_avx512f(local_3600,local_35c0);
      auVar90 = vaddpd_avx512f(auVar90,local_3940);
      auVar90 = vaddpd_avx512f(auVar90,local_3a40);
      auVar74 = vaddpd_avx512f(auVar90,auVar74);
      local_5c40 = vaddpd_avx512f(auVar74,auVar72);
      auVar74 = vaddpd_avx512f(local_3680,local_3640);
      auVar72 = vaddpd_avx512f(local_3d40,local_3ac0);
      auVar90 = vaddpd_avx512f(local_45c0,local_4580);
      auVar95 = vmulpd_avx512f(auVar92,local_5e00);
      auVar74 = vaddpd_avx512f(auVar74,local_3880);
      auVar72 = vaddpd_avx512f(auVar72,local_3e40);
      auVar90 = vaddpd_avx512f(auVar90,local_4600);
      auVar74 = vaddpd_avx512f(auVar74,local_3980);
      auVar72 = vaddpd_avx512f(auVar72,local_3f40);
      auVar90 = vaddpd_avx512f(auVar90,local_4680);
      auVar74 = vaddpd_avx512f(auVar74,local_3a80);
      auVar72 = vaddpd_avx512f(auVar72,auVar76);
      auVar76 = vaddpd_avx512f(auVar90,auVar80);
      local_5c80 = vaddpd_avx512f(auVar74,auVar73);
      auVar74 = vaddpd_avx512f(auVar72,auVar83);
      auVar72 = vaddpd_avx512f(auVar76,auVar102);
      auVar73 = vmulpd_avx512f(auVar93,local_5ec0);
      auVar76 = vaddpd_avx512f(local_3d00,local_3b00);
      auVar80 = vaddpd_avx512f(local_37c0,local_36c0);
      auVar83 = vaddpd_avx512f(local_3740,local_3700);
      auVar76 = vaddpd_avx512f(auVar76,local_3d80);
      auVar80 = vaddpd_avx512f(auVar80,local_3800);
      auVar76 = vaddpd_avx512f(auVar76,local_3e80);
      auVar80 = vaddpd_avx512f(auVar80,local_38c0);
      auVar80 = vaddpd_avx512f(auVar80,local_39c0);
      auVar76 = vaddpd_avx512f(auVar76,auVar82);
      auVar82 = vaddpd_avx512f(local_3bc0,local_3b80);
      auVar76 = vaddpd_avx512f(auVar76,auVar81);
      auVar81 = vaddpd_avx512f(local_3c40,local_3b40);
      auVar82 = vaddpd_avx512f(auVar82,local_3c00);
      auVar75 = vaddpd_avx512f(auVar80,auVar75);
      auVar80 = vaddpd_avx512f(auVar83,local_3780);
      auVar83 = vaddpd_avx512f(local_4240,local_3fc0);
      auVar81 = vaddpd_avx512f(auVar81,local_3c80);
      auVar82 = vaddpd_avx512f(auVar82,local_3cc0);
      auVar80 = vaddpd_avx512f(auVar80,local_3840);
      auVar83 = vaddpd_avx512f(auVar83,local_4340);
      auVar90 = vaddpd_avx512f(local_4200,local_4000);
      auVar81 = vaddpd_avx512f(auVar81,local_3dc0);
      auVar82 = vaddpd_avx512f(auVar82,local_3e00);
      auVar80 = vaddpd_avx512f(auVar80,local_3900);
      auVar83 = vaddpd_avx512f(auVar83,local_4440);
      auVar81 = vaddpd_avx512f(auVar81,local_3ec0);
      auVar82 = vaddpd_avx512f(auVar82,local_3f00);
      auVar80 = vaddpd_avx512f(auVar80,local_3a00);
      auVar81 = vaddpd_avx512f(auVar81,local_3f80);
      auVar83 = vaddpd_avx512f(auVar83,auVar86);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_5fc0;
      auVar86 = vbroadcastsd_avx512f(auVar41);
      auVar96 = vmulpd_avx512f(auVar86,_local_6180);
      auVar83 = vaddpd_avx512f(auVar83,auVar85);
      auVar85 = vaddpd_avx512f(auVar90,local_4280);
      auVar90 = vaddpd_avx512f(local_4140,local_4040);
      auVar85 = vaddpd_avx512f(auVar85,local_4380);
      auVar85 = vaddpd_avx512f(auVar85,local_4480);
      auVar85 = vaddpd_avx512f(auVar85,auVar87);
      auVar87 = vaddpd_avx512f(auVar90,local_4180);
      auVar90 = vaddpd_avx512f(local_40c0,local_4080);
      auVar87 = vaddpd_avx512f(auVar87,local_42c0);
      auVar87 = vaddpd_avx512f(auVar87,local_43c0);
      auVar84 = vaddpd_avx512f(auVar87,auVar84);
      auVar87 = vaddpd_avx512f(auVar90,local_4100);
      auVar90 = vmulpd_avx512f(auVar93,_local_5f40);
      auVar87 = vaddpd_avx512f(auVar87,local_41c0);
      auVar87 = vaddpd_avx512f(auVar87,local_4300);
      auVar87 = vaddpd_avx512f(auVar87,local_4400);
      auVar90 = vaddpd_avx512f(auVar96,auVar90);
      auVar96 = vmulpd_avx512f(auVar78,local_5c00);
      auVar90 = vaddpd_avx512f(auVar90,auVar95);
      auVar95 = vmulpd_avx512f(auVar89,local_5a00);
      auVar90 = vaddpd_avx512f(auVar90,auVar96);
      auVar96 = vmulpd_avx512f(auVar91,local_5b00);
      auVar90 = vaddpd_avx512f(auVar90,auVar95);
      auVar95 = vmulpd_avx512f(auVar92,local_5dc0);
      auVar90 = vaddpd_avx512f(auVar90,auVar96);
      auVar96 = vmulpd_avx512f(auVar86,local_6140);
      auVar94 = vaddpd_avx512f(auVar96,auVar94);
      auVar96 = vmulpd_avx512f(auVar78,local_5bc0);
      auVar94 = vaddpd_avx512f(auVar94,auVar95);
      auVar95 = vmulpd_avx512f(auVar89,local_59c0);
      auVar94 = vaddpd_avx512f(auVar94,auVar96);
      auVar96 = vmulpd_avx512f(auVar91,local_5ac0);
      auVar94 = vaddpd_avx512f(auVar94,auVar95);
      auVar95 = vmulpd_avx512f(auVar86,local_6100);
      auVar86 = vmulpd_avx512f(auVar86,local_60c0);
      auVar94 = vaddpd_avx512f(auVar94,auVar96);
      auVar96 = vmulpd_avx512f(auVar78,local_5b80);
      auVar73 = vaddpd_avx512f(auVar95,auVar73);
      auVar95 = vmulpd_avx512f(auVar92,local_5d80);
      auVar73 = vaddpd_avx512f(auVar73,auVar95);
      auVar95 = vmulpd_avx512f(auVar89,local_5980);
      auVar73 = vaddpd_avx512f(auVar73,auVar96);
      auVar96 = vmulpd_avx512f(auVar91,local_5a80);
      auVar73 = vaddpd_avx512f(auVar73,auVar95);
      auVar92 = vmulpd_avx512f(auVar92,local_5d40);
      auVar73 = vaddpd_avx512f(auVar73,auVar96);
      auVar93 = vmulpd_avx512f(auVar93,local_5e80);
      auVar86 = vaddpd_avx512f(auVar86,auVar93);
      auVar78 = vmulpd_avx512f(auVar78,local_5b40);
      auVar86 = vaddpd_avx512f(auVar86,auVar92);
      auVar89 = vmulpd_avx512f(auVar89,local_5940);
      auVar78 = vaddpd_avx512f(auVar86,auVar78);
      auVar86 = vmulpd_avx512f(auVar91,local_5a40);
      auVar78 = vaddpd_avx512f(auVar78,auVar89);
      auVar78 = vaddpd_avx512f(auVar78,auVar86);
      do {
        if ((((~((long)uVar50 >> 0x3f) & uVar50) == uVar63) || ((long)dVar55 < (long)uVar1)) ||
           ((long)dVar55 < lVar56)) goto LAB_00778d93;
        auVar86 = *(undefined1 (*) [64])(pdVar51 + (local_6230 - 0x18));
        auVar89 = *(undefined1 (*) [64])(pdVar51 + (long)local_5f60 + -0x18);
        auVar91 = *(undefined1 (*) [64])(pdVar51 + (long)local_5f58 + -0x18);
        auVar92 = vmulpd_avx512f(auVar86,local_6200);
        auVar93 = vmulpd_avx512f(auVar90,auVar89);
        auVar95 = vmulpd_avx512f(auVar77,auVar91);
        auVar92 = vaddpd_avx512f(auVar92,auVar93);
        auVar92 = vaddpd_avx512f(auVar92,auVar95);
        pauVar61[-0xb] = auVar92;
        auVar92 = *(undefined1 (*) [64])(pdVar51 + (local_6230 - 0x10));
        auVar93 = *(undefined1 (*) [64])(pdVar51 + (long)local_5f60 + -0x10);
        auVar95 = *(undefined1 (*) [64])(pdVar51 + (long)local_5f58 + -0x10);
        auVar96 = vmulpd_avx512f(auVar92,local_5e40);
        auVar97 = vmulpd_avx512f(auVar94,auVar93);
        auVar98 = vmulpd_avx512f(auVar79,auVar95);
        auVar96 = vaddpd_avx512f(auVar96,auVar97);
        auVar96 = vaddpd_avx512f(auVar96,auVar98);
        pauVar61[-10] = auVar96;
        auVar96 = *(undefined1 (*) [64])(pdVar51 + (local_6230 - 8));
        auVar97 = *(undefined1 (*) [64])(pdVar51 + (long)local_5f60 + -8);
        auVar98 = vmulpd_avx512f(auVar96,local_5cc0);
        auVar99 = vmulpd_avx512f(auVar73,auVar97);
        auVar99 = vaddpd_avx512f(auVar98,auVar99);
        auVar98 = *(undefined1 (*) [64])(pdVar51 + (long)local_5f58 + -8);
        auVar100 = vmulpd_avx512f(auVar88,auVar98);
        auVar99 = vaddpd_avx512f(auVar99,auVar100);
        pauVar61[-9] = auVar99;
        auVar99 = *(undefined1 (*) [64])(pdVar51 + local_6230);
        auVar100 = *(undefined1 (*) [64])(pdVar51 + (long)local_5f60);
        auVar101 = vmulpd_avx512f(auVar99,local_5d00);
        auVar102 = vmulpd_avx512f(auVar78,auVar100);
        auVar102 = vaddpd_avx512f(auVar101,auVar102);
        auVar101 = *(undefined1 (*) [64])(pdVar51 + (long)local_5f58);
        auVar103 = vmulpd_avx512f(auVar72,auVar101);
        auVar102 = vaddpd_avx512f(auVar102,auVar103);
        pauVar61[-8] = auVar102;
        if ((long)uVar50 <= (long)uVar63 || bVar52) goto LAB_00778d93;
        auVar102 = vmulpd_avx512f(auVar89,local_5c40);
        auVar103 = vmulpd_avx512f(auVar90,auVar86);
        auVar86 = vmulpd_avx512f(auVar77,auVar86);
        uVar63 = uVar63 + 1;
        pdVar51 = pdVar51 + (long)dVar55;
        auVar102 = vaddpd_avx512f(auVar103,auVar102);
        auVar103 = vmulpd_avx512f(auVar83,auVar91);
        auVar102 = vaddpd_avx512f(auVar102,auVar103);
        auVar103 = vmulpd_avx512f(auVar93,local_5c80);
        pauVar61[-7] = auVar102;
        auVar102 = vmulpd_avx512f(auVar94,auVar92);
        auVar102 = vaddpd_avx512f(auVar102,auVar103);
        auVar103 = vmulpd_avx512f(auVar85,auVar95);
        auVar102 = vaddpd_avx512f(auVar102,auVar103);
        auVar103 = vmulpd_avx512f(auVar75,auVar97);
        pauVar61[-6] = auVar102;
        auVar102 = vmulpd_avx512f(auVar73,auVar96);
        auVar102 = vaddpd_avx512f(auVar102,auVar103);
        auVar103 = vmulpd_avx512f(auVar84,auVar98);
        auVar102 = vaddpd_avx512f(auVar102,auVar103);
        auVar103 = vmulpd_avx512f(auVar80,auVar100);
        pauVar61[-5] = auVar102;
        auVar102 = vmulpd_avx512f(auVar78,auVar99);
        auVar102 = vaddpd_avx512f(auVar102,auVar103);
        auVar103 = vmulpd_avx512f(auVar87,auVar101);
        auVar102 = vaddpd_avx512f(auVar102,auVar103);
        auVar89 = vmulpd_avx512f(auVar83,auVar89);
        auVar92 = vmulpd_avx512f(auVar79,auVar92);
        pauVar61[-4] = auVar102;
        auVar86 = vaddpd_avx512f(auVar86,auVar89);
        auVar89 = vmulpd_avx512f(auVar74,auVar91);
        auVar91 = vmulpd_avx512f(auVar85,auVar93);
        auVar86 = vaddpd_avx512f(auVar86,auVar89);
        auVar89 = vmulpd_avx512f(auVar88,auVar96);
        pauVar61[-3] = auVar86;
        auVar86 = vaddpd_avx512f(auVar92,auVar91);
        auVar91 = vmulpd_avx512f(auVar76,auVar95);
        auVar92 = vmulpd_avx512f(auVar84,auVar97);
        auVar86 = vaddpd_avx512f(auVar86,auVar91);
        pauVar61[-2] = auVar86;
        auVar86 = vaddpd_avx512f(auVar89,auVar92);
        auVar89 = vmulpd_avx512f(auVar81,auVar98);
        auVar91 = vmulpd_avx512f(auVar72,auVar99);
        auVar92 = vmulpd_avx512f(auVar87,auVar100);
        auVar86 = vaddpd_avx512f(auVar86,auVar89);
        pauVar61[-1] = auVar86;
        auVar86 = vaddpd_avx512f(auVar91,auVar92);
        auVar89 = vmulpd_avx512f(auVar82,auVar101);
        auVar86 = vaddpd_avx512f(auVar86,auVar89);
        *pauVar61 = auVar86;
        pauVar61 = pauVar61 + 0xc;
      } while (uVar63 != 0x10);
      lVar64 = 0x10;
      lVar67 = 8;
      pauVar61 = (undefined1 (*) [64])local_2f40;
      lVar49 = 0;
      lVar65 = 0;
      lVar56 = 0;
      local_46c0._0_8_ = uVar50;
      do {
        pdVar43 = (local_6240->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        lVar44 = (local_6240->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value;
        local_5900._0_8_ = lVar56;
        local_5cc0._0_8_ = lVar64;
        local_5d00._0_8_ = lVar67;
        local_5c80._0_8_ = lVar49;
        local_5c40._0_8_ = pauVar61;
        lVar45 = (local_6240->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        bVar52 = (long)uVar50 <= lVar56 || (long)dVar55 < (long)local_5f48;
        local_6200[0] = bVar52;
        pauVar2 = (undefined1 (*) [64])
                  (*(long *)local_6188 + local_6228 + (long)dVar55 * lVar56 * 8);
        lVar70 = lVar56 * 3 + 1;
        lVar57 = lVar56 * 3 + 2;
        lVar68 = lVar45 + 1;
        lVar60 = lVar64 * lVar68;
        lVar45 = lVar45 * 0x18;
        lVar62 = lVar67 * lVar68;
        lVar68 = lVar68 * lVar49;
        lVar59 = 0;
        lVar66 = 0;
        local_5e40._0_8_ = lVar45;
        pauVar69 = pauVar61;
        do {
          local_5f50 = dVar55;
          if (bVar52) {
            __function = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 96>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 96, InnerPanel = false]"
            ;
            goto LAB_00778dbf;
          }
          if ((lVar44 <= lVar56 * 3) ||
             ((local_6240->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value <= lVar65 + lVar66)) {
LAB_00778d71:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          auVar42._8_8_ = 0;
          auVar42._0_8_ = local_6198;
          auVar74 = vbroadcastsd_avx512f(auVar42);
          auVar72 = vmulpd_avx512f(auVar74,pauVar2[1]);
          auVar73 = vmulpd_avx512f(auVar74,pauVar2[2]);
          auVar75 = vmulpd_avx512f(auVar74,*pauVar2);
          auVar76 = vmulpd_avx512f(auVar74,pauVar2[4]);
          auVar77 = vmulpd_avx512f(auVar74,pauVar2[7]);
          auVar72 = vmulpd_avx512f(auVar72,pauVar69[-10]);
          auVar73 = vmulpd_avx512f(auVar73,pauVar69[-9]);
          auVar75 = vmulpd_avx512f(auVar75,pauVar69[-0xb]);
          auVar72 = vaddpd_avx512f(auVar72,auVar73);
          auVar73 = vmulpd_avx512f(auVar76,pauVar69[-7]);
          auVar76 = vmulpd_avx512f(auVar74,pauVar2[5]);
          auVar72 = vaddpd_avx512f(auVar75,auVar72);
          auVar75 = vmulpd_avx512f(auVar74,pauVar2[3]);
          auVar76 = vmulpd_avx512f(auVar76,pauVar69[-6]);
          auVar75 = vmulpd_avx512f(auVar75,pauVar69[-8]);
          auVar73 = vaddpd_avx512f(auVar73,auVar76);
          auVar76 = vmulpd_avx512f(auVar74,pauVar2[8]);
          auVar73 = vaddpd_avx512f(auVar75,auVar73);
          auVar75 = vmulpd_avx512f(auVar77,pauVar69[-4]);
          auVar76 = vmulpd_avx512f(auVar76,pauVar69[-3]);
          auVar72 = vaddpd_avx512f(auVar72,auVar73);
          auVar73 = vmulpd_avx512f(auVar74,pauVar2[6]);
          auVar73 = vmulpd_avx512f(auVar73,pauVar69[-5]);
          auVar75 = vaddpd_avx512f(auVar75,auVar76);
          auVar76 = vmulpd_avx512f(auVar74,pauVar2[9]);
          auVar73 = vaddpd_avx512f(auVar73,auVar75);
          auVar75 = vmulpd_avx512f(auVar76,pauVar69[-2]);
          auVar76 = vmulpd_avx512f(auVar74,pauVar2[10]);
          auVar74 = vmulpd_avx512f(auVar74,pauVar2[0xb]);
          auVar76 = vmulpd_avx512f(auVar76,pauVar69[-1]);
          auVar74 = vmulpd_avx512f(auVar74,*pauVar69);
          auVar74 = vaddpd_avx512f(auVar76,auVar74);
          auVar74 = vaddpd_avx512f(auVar75,auVar74);
          auVar74 = vaddpd_avx512f(auVar73,auVar74);
          auVar74 = vaddpd_avx512f(auVar72,auVar74);
          auVar71 = vextractf64x4_avx512f(auVar74,1);
          dVar104 = auVar74._0_8_ + auVar71._0_8_ + auVar74._8_8_ + auVar71._8_8_ +
                    auVar74._16_8_ + auVar71._16_8_ + auVar74._24_8_ + auVar71._24_8_;
          *(double *)((long)pdVar43 + lVar66 * 8 + lVar68) =
               dVar104 + *(double *)((long)pdVar43 + lVar66 * 8 + lVar68);
          if (((lVar44 <= lVar70) ||
              ((lVar3 = lVar65 + 1 + lVar66,
               (local_6240->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value <= lVar3 ||
               (*(double *)((long)pdVar43 + lVar66 * 8 + lVar62) =
                     dVar104 + *(double *)((long)pdVar43 + lVar66 * 8 + lVar62), lVar44 <= lVar57)))
              ) || (lVar4 = lVar65 + 2 + lVar66,
                   (local_6240->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value <= lVar4)) goto LAB_00778d71;
          *(double *)((long)pdVar43 + lVar66 * 8 + lVar60) =
               dVar104 + *(double *)((long)pdVar43 + lVar66 * 8 + lVar60);
          if (lVar66 != 0) {
            if (((((lVar44 <= lVar65 + lVar66) ||
                  ((local_6240->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value <= lVar56 * 3)) ||
                 (*(double *)((long)pdVar43 + lVar59 + lVar68) =
                       dVar104 + *(double *)((long)pdVar43 + lVar59 + lVar68), lVar44 <= lVar3)) ||
                (((local_6240->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value <= lVar70 ||
                 (*(double *)((long)pdVar43 + lVar59 + lVar62) =
                       dVar104 + *(double *)((long)pdVar43 + lVar59 + lVar62), lVar44 <= lVar4))))
               || ((local_6240->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value <= lVar57)) goto LAB_00778d71;
            *(double *)((long)pdVar43 + lVar59 + lVar60) =
                 dVar104 + *(double *)((long)pdVar43 + lVar59 + lVar60);
          }
          lVar59 = lVar59 + lVar45;
          lVar3 = lVar65 + 3 + lVar66;
          pauVar69 = pauVar69 + 0xc;
          lVar66 = lVar66 + 3;
        } while (lVar3 != 0x30);
        lVar65 = lVar65 + 3;
        lVar56 = lVar56 + 1;
        lVar64 = lVar64 + 0x18;
        lVar67 = lVar67 + 0x18;
        lVar49 = lVar49 + 0x18;
        pauVar61 = pauVar61 + 0xc;
      } while (lVar56 != 0x10);
      if (local_6260.m_data != (double *)0x0) {
        free((void *)local_6260.m_data[-1]);
      }
      uVar50 = local_6230;
      iVar53 = local_6234;
      if (local_6280.m_data != (double *)0x0) {
        free((void *)local_6280.m_data[-1]);
      }
      if ((double *)local_6220._0_8_ != (double *)0x0) {
        free(*(void **)(local_6220._0_8_ + -8));
      }
      local_6238 = local_6238 + 0x60;
      local_6234 = iVar53 + 0x60;
      local_6230 = (ulong)((int)uVar50 + 0x60);
      dVar55 = (double)((long)local_6190 + 1);
    } while ((long)dVar55 < (long)this->m_numLayers);
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalJacobianContIntNoDamping(ChMatrixRef& H, double Kfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear material model (no damping).  For this style of method, the Jacobian of the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For a small number of layers this method can be more efficient than the "Pre-Integration" style calculation
    // method.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // Zero out the Jacobian matrix since the results from each layer will be added to this value
    H.setZero();

    // Sum the contribution to the Jacobian matrix layer by layer
    for (int kl = 0; kl < m_numLayers; kl++) {
        // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
        // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
        // up the generalized internal force calculation while only having a minimal impact on the performance of the
        // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
        // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
        // and sparse component.

        // =============================================================================
        // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
        // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
        // will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31 ]
        // FC = [F12  F22  F32 ]
        //      [F13  F23  F33 ]
        // =============================================================================
        ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * e_bar.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
        // time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
        //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
        //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
        //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
        //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
        //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
        // Note that each partial derivative block shown is placed to the left of the previous block.
        // The explanation of the calculation above is just too long to write it all on a single line.
        // =============================================================================
        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
        PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 0).transpose());
            PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 2 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 0).transpose());

            PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

            PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Scale the block deformation gradient matrix by the Kfactor weighting factor for the Jacobian and multiply
        // each Gauss quadrature component by its Gauss quadrature weight times the element Jacobian (kGQ)
        // =============================================================================
        ChMatrixNMc<double, 3 * NIP, 3> FCscaled = Kfactor * FC;

        for (auto i = 0; i < 3; i++) {
            FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
        }

        // =============================================================================
        // Calculate the scaled partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // and the other parameters to correctly integrate across the volume of the element.  This calculation is
        // performed in blocks across all the Gauss quadrature points at the same time.  This value should be store in
        // row major memory layout to align with the access patterns for calculating this matrix.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
        Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer at rotate it in the midsurface according to
        // the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in this
        // element
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
        // Gauss quadrature point
        // =============================================================================
        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
        DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
            D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
            D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
            D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
            D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
            D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
            D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

        // =============================================================================
        // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
        // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
        // =============================================================================

        H.noalias() += PE * DScaled_Combined_PE.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the sparse and symmetric component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
        // corresponding Gauss point (m_kGQ) for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block.array() *= 0.5 * m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block.array() *= 0.5 * m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block.array() *= 0.5 * m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*2*E23 = kGQ*(F12*F13+F22*F23+F32*F33)
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*2*E13 = kGQ*(F11*F13+F21*F23+F31*F33)
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*2*E12 = (F11*F12+F21*F22+F31*F32)
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
        // quadrature point
        // =============================================================================

        ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

        for (auto i = 0; i < NSF; i++) {
            S_scaled_SD.template block<1, NIP>(i, 0) =
                SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, NIP) =
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));
        }

        // =============================================================================
        // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
        // matrix and then expand them out to full size by summing the contribution into the correct locations of the
        // full sized Jacobian matrix
        // =============================================================================
        unsigned int idx = 0;
        for (unsigned int i = 0; i < NSF; i++) {
            for (unsigned int j = i; j < NSF; j++) {
                double d = Kfactor * m_SD.block<1, 3 * NIP>(i, 3 * kl * NIP) *
                           S_scaled_SD.template block<1, 3 * NIP>(j, 0).transpose();

                H(3 * i, 3 * j) += d;
                H(3 * i + 1, 3 * j + 1) += d;
                H(3 * i + 2, 3 * j + 2) += d;
                if (i != j) {
                    H(3 * j, 3 * i) += d;
                    H(3 * j + 1, 3 * i + 1) += d;
                    H(3 * j + 2, 3 * i + 2) += d;
                }
                idx++;
            }
        }
    }
}